

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [12];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  byte bVar58;
  long lVar59;
  byte bVar60;
  uint uVar61;
  ulong uVar62;
  byte bVar63;
  bool bVar64;
  long lVar65;
  bool bVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar127;
  uint uVar128;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  uint uVar130;
  uint uVar131;
  uint uVar132;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  uint uVar129;
  uint uVar133;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar134;
  float fVar152;
  float fVar154;
  vint4 bi_2;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar159;
  vint4 bi_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar173 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  float fVar179;
  float fVar205;
  float fVar206;
  vint4 bi;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar207;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar228;
  float fVar229;
  vint4 ai_2;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar230;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar231;
  float fVar232;
  undefined1 auVar227 [32];
  vint4 ai_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar238;
  float fVar239;
  undefined1 auVar237 [32];
  vint4 ai;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  float fVar249;
  float fVar252;
  undefined1 auVar250 [16];
  float fVar253;
  undefined1 auVar251 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [28];
  float fVar256;
  undefined1 auVar257 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  undefined1 local_9c0 [16];
  uint local_9b0;
  int local_9ac;
  float local_9a8;
  float local_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  ulong local_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  Primitive *local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  RTCHitN local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  uint local_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  uint uStack_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar258 [16];
  
  PVar2 = prim[1];
  uVar67 = (ulong)(byte)PVar2;
  lVar59 = uVar67 * 0x25;
  fVar249 = *(float *)(prim + lVar59 + 0x12);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar74 = vsubps_avx(auVar74,*(undefined1 (*) [16])(prim + lVar59 + 6));
  auVar208._0_4_ = fVar249 * auVar74._0_4_;
  auVar208._4_4_ = fVar249 * auVar74._4_4_;
  auVar208._8_4_ = fVar249 * auVar74._8_4_;
  auVar208._12_4_ = fVar249 * auVar74._12_4_;
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar135._0_4_ = fVar249 * auVar73._0_4_;
  auVar135._4_4_ = fVar249 * auVar73._4_4_;
  auVar135._8_4_ = fVar249 * auVar73._8_4_;
  auVar135._12_4_ = fVar249 * auVar73._12_4_;
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xf + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar67 + 6)));
  auVar222 = vcvtdq2ps_avx(auVar222);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1a + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1b + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1c + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar233._4_4_ = auVar135._0_4_;
  auVar233._0_4_ = auVar135._0_4_;
  auVar233._8_4_ = auVar135._0_4_;
  auVar233._12_4_ = auVar135._0_4_;
  auVar80 = vshufps_avx(auVar135,auVar135,0x55);
  auVar79 = vshufps_avx(auVar135,auVar135,0xaa);
  fVar249 = auVar79._0_4_;
  auVar180._0_4_ = fVar249 * auVar76._0_4_;
  fVar152 = auVar79._4_4_;
  auVar180._4_4_ = fVar152 * auVar76._4_4_;
  fVar239 = auVar79._8_4_;
  auVar180._8_4_ = fVar239 * auVar76._8_4_;
  fVar252 = auVar79._12_4_;
  auVar180._12_4_ = fVar252 * auVar76._12_4_;
  auVar160._0_4_ = auVar222._0_4_ * fVar249;
  auVar160._4_4_ = auVar222._4_4_ * fVar152;
  auVar160._8_4_ = auVar222._8_4_ * fVar239;
  auVar160._12_4_ = auVar222._12_4_ * fVar252;
  auVar136._0_4_ = auVar78._0_4_ * fVar249;
  auVar136._4_4_ = auVar78._4_4_ * fVar152;
  auVar136._8_4_ = auVar78._8_4_ * fVar239;
  auVar136._12_4_ = auVar78._12_4_ * fVar252;
  auVar79 = vfmadd231ps_fma(auVar180,auVar80,auVar73);
  auVar21 = vfmadd231ps_fma(auVar160,auVar80,auVar82);
  auVar80 = vfmadd231ps_fma(auVar136,auVar75,auVar80);
  auVar22 = vfmadd231ps_fma(auVar79,auVar233,auVar74);
  auVar21 = vfmadd231ps_fma(auVar21,auVar233,auVar81);
  auVar23 = vfmadd231ps_fma(auVar80,auVar77,auVar233);
  auVar264._4_4_ = auVar208._0_4_;
  auVar264._0_4_ = auVar208._0_4_;
  auVar264._8_4_ = auVar208._0_4_;
  auVar264._12_4_ = auVar208._0_4_;
  auVar80 = vshufps_avx(auVar208,auVar208,0x55);
  auVar79 = vshufps_avx(auVar208,auVar208,0xaa);
  fVar249 = auVar79._0_4_;
  auVar234._0_4_ = fVar249 * auVar76._0_4_;
  fVar152 = auVar79._4_4_;
  auVar234._4_4_ = fVar152 * auVar76._4_4_;
  fVar239 = auVar79._8_4_;
  auVar234._8_4_ = fVar239 * auVar76._8_4_;
  fVar252 = auVar79._12_4_;
  auVar234._12_4_ = fVar252 * auVar76._12_4_;
  auVar219._0_4_ = auVar222._0_4_ * fVar249;
  auVar219._4_4_ = auVar222._4_4_ * fVar152;
  auVar219._8_4_ = auVar222._8_4_ * fVar239;
  auVar219._12_4_ = auVar222._12_4_ * fVar252;
  auVar209._0_4_ = auVar78._0_4_ * fVar249;
  auVar209._4_4_ = auVar78._4_4_ * fVar152;
  auVar209._8_4_ = auVar78._8_4_ * fVar239;
  auVar209._12_4_ = auVar78._12_4_ * fVar252;
  auVar73 = vfmadd231ps_fma(auVar234,auVar80,auVar73);
  auVar76 = vfmadd231ps_fma(auVar219,auVar80,auVar82);
  auVar82 = vfmadd231ps_fma(auVar209,auVar80,auVar75);
  auVar24 = vfmadd231ps_fma(auVar73,auVar264,auVar74);
  auVar135 = vfmadd231ps_fma(auVar76,auVar264,auVar81);
  auVar250._8_4_ = 0x7fffffff;
  auVar250._0_8_ = 0x7fffffff7fffffff;
  auVar250._12_4_ = 0x7fffffff;
  auVar136 = vfmadd231ps_fma(auVar82,auVar264,auVar77);
  auVar74 = vandps_avx(auVar250,auVar22);
  auVar245._8_4_ = 0x219392ef;
  auVar245._0_8_ = 0x219392ef219392ef;
  auVar245._12_4_ = 0x219392ef;
  uVar62 = vcmpps_avx512vl(auVar74,auVar245,1);
  bVar64 = (bool)((byte)uVar62 & 1);
  auVar70._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar22._0_4_;
  bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar22._4_4_;
  bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar22._8_4_;
  bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar22._12_4_;
  auVar74 = vandps_avx(auVar250,auVar21);
  uVar62 = vcmpps_avx512vl(auVar74,auVar245,1);
  bVar64 = (bool)((byte)uVar62 & 1);
  auVar71._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar21._0_4_;
  bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar21._4_4_;
  bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar21._8_4_;
  bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar21._12_4_;
  auVar74 = vandps_avx(auVar250,auVar23);
  uVar62 = vcmpps_avx512vl(auVar74,auVar245,1);
  bVar64 = (bool)((byte)uVar62 & 1);
  auVar72._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar23._0_4_;
  bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar23._4_4_;
  bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar23._8_4_;
  bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar23._12_4_;
  auVar73 = vrcp14ps_avx512vl(auVar70);
  auVar246._8_4_ = 0x3f800000;
  auVar246._0_8_ = 0x3f8000003f800000;
  auVar246._12_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar70,auVar73,auVar246);
  auVar22 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar71);
  auVar74 = vfnmadd213ps_fma(auVar71,auVar73,auVar246);
  auVar23 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar72);
  auVar74 = vfnmadd213ps_fma(auVar72,auVar73,auVar246);
  auVar20 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
  fVar249 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar59 + 0x16)) *
            *(float *)(prim + lVar59 + 0x1a);
  auVar240._4_4_ = fVar249;
  auVar240._0_4_ = fVar249;
  auVar240._8_4_ = fVar249;
  auVar240._12_4_ = fVar249;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar74 = vpmovsxwd_avx(auVar74);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar73 = vpmovsxwd_avx(auVar73);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar81 = vsubps_avx(auVar73,auVar74);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar73 = vpmovsxwd_avx(auVar76);
  auVar76 = vfmadd213ps_fma(auVar81,auVar240,auVar74);
  auVar74 = vcvtdq2ps_avx(auVar73);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar67 * 0xd + 6);
  auVar73 = vpmovsxwd_avx(auVar81);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar81 = vfmadd213ps_fma(auVar73,auVar240,auVar74);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar67 * 0x12 + 6);
  auVar74 = vpmovsxwd_avx(auVar82);
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar62 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar67 * 2 + uVar62 + 6);
  auVar73 = vpmovsxwd_avx(auVar222);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar82 = vfmadd213ps_fma(auVar73,auVar240,auVar74);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar62 + 6);
  auVar74 = vpmovsxwd_avx(auVar77);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar67 * 0x18 + 6);
  auVar73 = vpmovsxwd_avx(auVar75);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar222 = vfmadd213ps_fma(auVar73,auVar240,auVar74);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar67 * 0x1d + 6);
  auVar74 = vpmovsxwd_avx(auVar78);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar67 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar73 = vpmovsxwd_avx(auVar80);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar77 = vfmadd213ps_fma(auVar73,auVar240,auVar74);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar67) + 6);
  auVar74 = vpmovsxwd_avx(auVar79);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar67 * 0x23 + 6);
  auVar73 = vpmovsxwd_avx(auVar21);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar73 = vfmadd213ps_fma(auVar73,auVar240,auVar74);
  auVar74 = vsubps_avx(auVar76,auVar24);
  auVar241._0_4_ = auVar22._0_4_ * auVar74._0_4_;
  auVar241._4_4_ = auVar22._4_4_ * auVar74._4_4_;
  auVar241._8_4_ = auVar22._8_4_ * auVar74._8_4_;
  auVar241._12_4_ = auVar22._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar81,auVar24);
  auVar181._0_4_ = auVar22._0_4_ * auVar74._0_4_;
  auVar181._4_4_ = auVar22._4_4_ * auVar74._4_4_;
  auVar181._8_4_ = auVar22._8_4_ * auVar74._8_4_;
  auVar181._12_4_ = auVar22._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar82,auVar135);
  auVar235._0_4_ = auVar23._0_4_ * auVar74._0_4_;
  auVar235._4_4_ = auVar23._4_4_ * auVar74._4_4_;
  auVar235._8_4_ = auVar23._8_4_ * auVar74._8_4_;
  auVar235._12_4_ = auVar23._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar222,auVar135);
  auVar161._0_4_ = auVar23._0_4_ * auVar74._0_4_;
  auVar161._4_4_ = auVar23._4_4_ * auVar74._4_4_;
  auVar161._8_4_ = auVar23._8_4_ * auVar74._8_4_;
  auVar161._12_4_ = auVar23._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar77,auVar136);
  auVar220._0_4_ = auVar20._0_4_ * auVar74._0_4_;
  auVar220._4_4_ = auVar20._4_4_ * auVar74._4_4_;
  auVar220._8_4_ = auVar20._8_4_ * auVar74._8_4_;
  auVar220._12_4_ = auVar20._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar73,auVar136);
  auVar137._0_4_ = auVar20._0_4_ * auVar74._0_4_;
  auVar137._4_4_ = auVar20._4_4_ * auVar74._4_4_;
  auVar137._8_4_ = auVar20._8_4_ * auVar74._8_4_;
  auVar137._12_4_ = auVar20._12_4_ * auVar74._12_4_;
  auVar74 = vpminsd_avx(auVar241,auVar181);
  auVar73 = vpminsd_avx(auVar235,auVar161);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar73 = vpminsd_avx(auVar220,auVar137);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar22._4_4_ = uVar159;
  auVar22._0_4_ = uVar159;
  auVar22._8_4_ = uVar159;
  auVar22._12_4_ = uVar159;
  auVar73 = vmaxps_avx512vl(auVar73,auVar22);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar23._8_4_ = 0x3f7ffffa;
  auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar23._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar74,auVar23);
  auVar74 = vpmaxsd_avx(auVar241,auVar181);
  auVar73 = vpmaxsd_avx(auVar235,auVar161);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar73 = vpmaxsd_avx(auVar220,auVar137);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar20._4_4_ = uVar159;
  auVar20._0_4_ = uVar159;
  auVar20._8_4_ = uVar159;
  auVar20._12_4_ = uVar159;
  auVar73 = vminps_avx512vl(auVar73,auVar20);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar24._8_4_ = 0x3f800003;
  auVar24._0_8_ = 0x3f8000033f800003;
  auVar24._12_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar24);
  auVar73 = vpbroadcastd_avx512vl();
  uVar15 = vcmpps_avx512vl(local_3a0,auVar74,2);
  local_5c8 = vpcmpgtd_avx512vl(auVar73,_DAT_01f7fcf0);
  local_5c8 = ((byte)uVar15 & 0xf) & local_5c8;
  if ((char)local_5c8 == '\0') {
    return false;
  }
  local_510 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5d0 = prim;
LAB_01ba1509:
  lVar59 = 0;
  for (uVar62 = local_5c8; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  local_758 = (ulong)*(uint *)(local_5d0 + 2);
  pGVar3 = (context->scene->geometries).items[local_758].ptr;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_5d0 + lVar59 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar249 = (pGVar3->time_range).lower;
  fVar249 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar249) / ((pGVar3->time_range).upper - fVar249));
  auVar74 = vroundss_avx(ZEXT416((uint)fVar249),ZEXT416((uint)fVar249),9);
  auVar74 = vminss_avx(auVar74,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar74 = vmaxss_avx(ZEXT816(0) << 0x20,auVar74);
  fVar249 = fVar249 - auVar74._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar74._0_4_ * 0x38;
  lVar59 = *(long *)(_Var4 + 0x10 + lVar65);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar65);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar65);
  pfVar1 = (float *)(lVar5 + uVar62 * lVar6);
  auVar138._0_4_ = fVar249 * *pfVar1;
  auVar138._4_4_ = fVar249 * pfVar1[1];
  auVar138._8_4_ = fVar249 * pfVar1[2];
  auVar138._12_4_ = fVar249 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar62 + 1) * lVar6);
  auVar162._0_4_ = fVar249 * *pfVar1;
  auVar162._4_4_ = fVar249 * pfVar1[1];
  auVar162._8_4_ = fVar249 * pfVar1[2];
  auVar162._12_4_ = fVar249 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar62 + 2) * lVar6);
  auVar182._0_4_ = fVar249 * *pfVar1;
  auVar182._4_4_ = fVar249 * pfVar1[1];
  auVar182._8_4_ = fVar249 * pfVar1[2];
  auVar182._12_4_ = fVar249 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar62 + 3));
  auVar210._0_4_ = fVar249 * *pfVar1;
  auVar210._4_4_ = fVar249 * pfVar1[1];
  auVar210._8_4_ = fVar249 * pfVar1[2];
  auVar210._12_4_ = fVar249 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar65);
  fVar249 = 1.0 - fVar249;
  auVar221._4_4_ = fVar249;
  auVar221._0_4_ = fVar249;
  auVar221._8_4_ = fVar249;
  auVar221._12_4_ = fVar249;
  auVar76 = vfmadd231ps_fma(auVar138,auVar221,*(undefined1 (*) [16])(lVar5 + lVar59 * uVar62));
  auVar81 = vfmadd231ps_fma(auVar162,auVar221,*(undefined1 (*) [16])(lVar5 + lVar59 * (uVar62 + 1)))
  ;
  auVar82 = vfmadd231ps_fma(auVar182,auVar221,*(undefined1 (*) [16])(lVar5 + lVar59 * (uVar62 + 2)))
  ;
  auVar222 = vfmadd231ps_fma(auVar210,auVar221,*(undefined1 (*) [16])(lVar5 + lVar59 * (uVar62 + 3))
                            );
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar73 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar258._4_4_ = uVar159;
  auVar258._0_4_ = uVar159;
  auVar258._8_4_ = uVar159;
  auVar258._12_4_ = uVar159;
  fStack_3f0 = (float)uVar159;
  _local_400 = auVar258;
  fStack_3ec = (float)uVar159;
  fStack_3e8 = (float)uVar159;
  register0x0000151c = uVar159;
  auVar262 = ZEXT3264(_local_400);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar263._4_4_ = uVar159;
  auVar263._0_4_ = uVar159;
  auVar263._8_4_ = uVar159;
  auVar263._12_4_ = uVar159;
  local_420._16_4_ = uVar159;
  local_420._0_16_ = auVar263;
  local_420._20_4_ = uVar159;
  local_420._24_4_ = uVar159;
  local_420._28_4_ = uVar159;
  auVar74 = vunpcklps_avx(auVar258,auVar263);
  fVar249 = *(float *)(ray + k * 4 + 0x60);
  auVar265._4_4_ = fVar249;
  auVar265._0_4_ = fVar249;
  auVar265._8_4_ = fVar249;
  auVar265._12_4_ = fVar249;
  local_440._16_4_ = fVar249;
  local_440._0_16_ = auVar265;
  local_440._20_4_ = fVar249;
  local_440._24_4_ = fVar249;
  local_440._28_4_ = fVar249;
  local_6b0 = vinsertps_avx(auVar74,auVar265,0x28);
  auVar254 = ZEXT1664(local_6b0);
  auVar236._0_4_ = auVar76._0_4_ + auVar81._0_4_ + auVar82._0_4_ + auVar222._0_4_;
  auVar236._4_4_ = auVar76._4_4_ + auVar81._4_4_ + auVar82._4_4_ + auVar222._4_4_;
  auVar236._8_4_ = auVar76._8_4_ + auVar81._8_4_ + auVar82._8_4_ + auVar222._8_4_;
  auVar236._12_4_ = auVar76._12_4_ + auVar81._12_4_ + auVar82._12_4_ + auVar222._12_4_;
  auVar25._8_4_ = 0x3e800000;
  auVar25._0_8_ = 0x3e8000003e800000;
  auVar25._12_4_ = 0x3e800000;
  auVar74 = vmulps_avx512vl(auVar236,auVar25);
  auVar74 = vsubps_avx(auVar74,auVar73);
  auVar74 = vdpps_avx(auVar74,local_6b0,0x7f);
  fVar152 = *(float *)(ray + k * 4 + 0x30);
  local_6c0 = vdpps_avx(local_6b0,local_6b0,0x7f);
  auVar257 = ZEXT1664(local_6c0);
  local_4f0 = vpbroadcastd_avx512vl();
  auVar242._4_12_ = ZEXT812(0) << 0x20;
  auVar242._0_4_ = local_6c0._0_4_;
  auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar242);
  auVar77 = vfnmadd213ss_fma(auVar75,local_6c0,ZEXT416(0x40000000));
  local_2e0 = auVar74._0_4_ * auVar75._0_4_ * auVar77._0_4_;
  fVar239 = 0.0;
  auVar243._4_4_ = local_2e0;
  auVar243._0_4_ = local_2e0;
  auVar243._8_4_ = local_2e0;
  auVar243._12_4_ = local_2e0;
  fStack_990 = local_2e0;
  _local_9a0 = auVar243;
  fStack_98c = local_2e0;
  fStack_988 = local_2e0;
  fStack_984 = local_2e0;
  auVar74 = vfmadd231ps_fma(auVar73,local_6b0,auVar243);
  auVar74 = vblendps_avx(auVar74,ZEXT816(0) << 0x40,8);
  auVar73 = vsubps_avx(auVar76,auVar74);
  auVar76 = vsubps_avx(auVar82,auVar74);
  auVar248 = ZEXT1664(auVar76);
  auVar81 = vsubps_avx(auVar81,auVar74);
  auVar251 = ZEXT1664(auVar81);
  auVar74 = vsubps_avx(auVar222,auVar74);
  local_8c0 = vbroadcastss_avx512vl(auVar73);
  auVar275 = ZEXT3264(local_8c0);
  auVar84._8_4_ = 1;
  auVar84._0_8_ = 0x100000001;
  auVar84._12_4_ = 1;
  auVar84._16_4_ = 1;
  auVar84._20_4_ = 1;
  auVar84._24_4_ = 1;
  auVar84._28_4_ = 1;
  local_640 = ZEXT1632(auVar73);
  local_8e0 = vpermps_avx512vl(auVar84,local_640);
  auVar267 = ZEXT3264(local_8e0);
  auVar85._8_4_ = 2;
  auVar85._0_8_ = 0x200000002;
  auVar85._12_4_ = 2;
  auVar85._16_4_ = 2;
  auVar85._20_4_ = 2;
  auVar85._24_4_ = 2;
  auVar85._28_4_ = 2;
  local_900 = vpermps_avx512vl(auVar85,local_640);
  auVar268 = ZEXT3264(local_900);
  auVar88._8_4_ = 3;
  auVar88._0_8_ = 0x300000003;
  auVar88._12_4_ = 3;
  auVar88._16_4_ = 3;
  auVar88._20_4_ = 3;
  auVar88._24_4_ = 3;
  auVar88._28_4_ = 3;
  local_920 = vpermps_avx512vl(auVar88,local_640);
  auVar269 = ZEXT3264(local_920);
  local_800 = vbroadcastss_avx512vl(auVar81);
  auVar270 = ZEXT3264(local_800);
  local_680 = ZEXT1632(auVar81);
  local_940 = vpermps_avx512vl(auVar84,local_680);
  auVar271 = ZEXT3264(local_940);
  local_820 = vpermps_avx512vl(auVar85,local_680);
  auVar272 = ZEXT3264(local_820);
  local_960 = vpermps_avx512vl(auVar88,local_680);
  auVar273 = ZEXT3264(local_960);
  local_980 = vbroadcastss_avx512vl(auVar76);
  auVar274 = ZEXT3264(local_980);
  local_660 = ZEXT1632(auVar76);
  local_840 = vpermps_avx512vl(auVar84,local_660);
  auVar276 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar85,local_660);
  auVar277 = ZEXT3264(local_860);
  local_8a0 = vpermps_avx512vl(auVar88,local_660);
  auVar278 = ZEXT3264(local_8a0);
  local_260 = vbroadcastss_avx512vl(auVar74);
  _local_6a0 = ZEXT1632(auVar74);
  local_240 = vpermps_avx512vl(auVar84,_local_6a0);
  local_2a0 = vpermps_avx2(auVar85,_local_6a0);
  local_2c0 = vpermps_avx2(auVar88,_local_6a0);
  auVar74 = vfmadd231ps_fma(ZEXT432((uint)(fVar249 * fVar249)),local_420,local_420);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),_local_400,_local_400);
  local_220._0_4_ = auVar74._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  auVar87._16_4_ = 0x7fffffff;
  auVar87._20_4_ = 0x7fffffff;
  auVar87._24_4_ = 0x7fffffff;
  auVar87._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar87);
  local_620 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar152 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  uVar62 = 0;
  bVar64 = false;
  local_9ac = 1;
  local_500 = vpbroadcastd_avx512vl();
  auVar74 = vsqrtss_avx(local_6c0,local_6c0);
  local_9a4 = auVar74._0_4_;
  auVar74 = vsqrtss_avx(local_6c0,local_6c0);
  local_9a8 = auVar74._0_4_;
  auVar178 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_280 = local_240;
  do {
    local_390 = auVar178._0_16_;
    auVar74 = vmovshdup_avx(local_390);
    auVar74 = vsubps_avx(auVar74,local_390);
    local_6e0._0_4_ = auVar74._0_4_;
    fVar231 = local_6e0._0_4_ * 0.04761905;
    uVar159 = auVar178._0_4_;
    local_880._4_4_ = uVar159;
    local_880._0_4_ = uVar159;
    local_880._8_4_ = uVar159;
    local_880._12_4_ = uVar159;
    local_880._16_4_ = uVar159;
    local_880._20_4_ = uVar159;
    local_880._24_4_ = uVar159;
    local_880._28_4_ = uVar159;
    local_6e0._4_4_ = local_6e0._0_4_;
    local_6e0._8_4_ = local_6e0._0_4_;
    local_6e0._12_4_ = local_6e0._0_4_;
    local_6e0._16_4_ = local_6e0._0_4_;
    local_6e0._20_4_ = local_6e0._0_4_;
    local_6e0._24_4_ = local_6e0._0_4_;
    local_6e0._28_4_ = local_6e0._0_4_;
    auVar74 = vfmadd231ps_fma(local_880,local_6e0,_DAT_01faff20);
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar85 = vsubps_avx512vl(auVar84,ZEXT1632(auVar74));
    fVar249 = auVar85._0_4_;
    fVar253 = auVar85._4_4_;
    fVar216 = auVar85._8_4_;
    fVar238 = auVar85._12_4_;
    fVar228 = auVar85._16_4_;
    fVar229 = auVar85._20_4_;
    fVar230 = auVar85._24_4_;
    fVar134 = fVar249 * fVar249 * fVar249;
    fVar153 = fVar253 * fVar253 * fVar253;
    auVar89._4_4_ = fVar153;
    auVar89._0_4_ = fVar134;
    fVar154 = fVar216 * fVar216 * fVar216;
    auVar89._8_4_ = fVar154;
    fVar155 = fVar238 * fVar238 * fVar238;
    auVar89._12_4_ = fVar155;
    fVar156 = fVar228 * fVar228 * fVar228;
    auVar89._16_4_ = fVar156;
    fVar157 = fVar229 * fVar229 * fVar229;
    auVar89._20_4_ = fVar157;
    fVar158 = fVar230 * fVar230 * fVar230;
    auVar89._24_4_ = fVar158;
    auVar89._28_4_ = local_6e0._0_4_;
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar87 = vmulps_avx512vl(auVar89,auVar86);
    fVar252 = auVar74._0_4_;
    fVar215 = auVar74._4_4_;
    fVar217 = auVar74._8_4_;
    fVar218 = auVar74._12_4_;
    fVar179 = fVar252 * fVar252 * fVar252;
    fVar205 = fVar215 * fVar215 * fVar215;
    fVar206 = fVar217 * fVar217 * fVar217;
    fVar207 = fVar218 * fVar218 * fVar218;
    auVar109._28_4_ = DAT_01faff20._28_4_;
    auVar109._0_28_ = ZEXT1628(CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(fVar205,fVar179))));
    auVar178._0_4_ = fVar252 * fVar249;
    auVar178._4_4_ = fVar215 * fVar253;
    auVar178._8_4_ = fVar217 * fVar216;
    auVar178._12_4_ = fVar218 * fVar238;
    auVar178._16_4_ = fVar228 * 0.0;
    auVar178._20_4_ = fVar229 * 0.0;
    auVar178._28_36_ = auVar254._28_36_;
    auVar178._24_4_ = fVar230 * 0.0;
    auVar88 = vmulps_avx512vl(auVar109,auVar86);
    fVar256 = auVar88._28_4_ + local_6e0._0_4_;
    fVar232 = auVar257._28_4_;
    fVar239 = fVar256 + fVar232 + fVar239;
    auVar94._4_4_ = fVar153 * 0.16666667;
    auVar94._0_4_ = fVar134 * 0.16666667;
    auVar94._8_4_ = fVar154 * 0.16666667;
    auVar94._12_4_ = fVar155 * 0.16666667;
    auVar94._16_4_ = fVar156 * 0.16666667;
    auVar94._20_4_ = fVar157 * 0.16666667;
    auVar94._24_4_ = fVar158 * 0.16666667;
    auVar94._28_4_ = fVar256;
    auVar91._4_4_ =
         (auVar178._4_4_ * fVar253 * 12.0 + auVar178._4_4_ * fVar215 * 6.0 + fVar205 + auVar87._4_4_
         ) * 0.16666667;
    auVar91._0_4_ =
         (auVar178._0_4_ * fVar249 * 12.0 + auVar178._0_4_ * fVar252 * 6.0 + fVar179 + auVar87._0_4_
         ) * 0.16666667;
    auVar91._8_4_ =
         (auVar178._8_4_ * fVar216 * 12.0 + auVar178._8_4_ * fVar217 * 6.0 + fVar206 + auVar87._8_4_
         ) * 0.16666667;
    auVar91._12_4_ =
         (auVar178._12_4_ * fVar238 * 12.0 + auVar178._12_4_ * fVar218 * 6.0 +
         fVar207 + auVar87._12_4_) * 0.16666667;
    auVar91._16_4_ =
         (auVar178._16_4_ * fVar228 * 12.0 + auVar178._16_4_ * 0.0 * 6.0 + auVar87._16_4_ + 0.0) *
         0.16666667;
    auVar91._20_4_ =
         (auVar178._20_4_ * fVar229 * 12.0 + auVar178._20_4_ * 0.0 * 6.0 + auVar87._20_4_ + 0.0) *
         0.16666667;
    auVar91._24_4_ =
         (auVar178._24_4_ * fVar230 * 12.0 + auVar178._24_4_ * 0.0 * 6.0 + auVar87._24_4_ + 0.0) *
         0.16666667;
    auVar91._28_4_ = fVar232;
    auVar92._4_4_ =
         (auVar88._4_4_ + fVar153 + auVar178._4_4_ * fVar215 * 12.0 + auVar178._4_4_ * fVar253 * 6.0
         ) * 0.16666667;
    auVar92._0_4_ =
         (auVar88._0_4_ + fVar134 + auVar178._0_4_ * fVar252 * 12.0 + auVar178._0_4_ * fVar249 * 6.0
         ) * 0.16666667;
    auVar92._8_4_ =
         (auVar88._8_4_ + fVar154 + auVar178._8_4_ * fVar217 * 12.0 + auVar178._8_4_ * fVar216 * 6.0
         ) * 0.16666667;
    auVar92._12_4_ =
         (auVar88._12_4_ + fVar155 +
         auVar178._12_4_ * fVar218 * 12.0 + auVar178._12_4_ * fVar238 * 6.0) * 0.16666667;
    auVar92._16_4_ =
         (auVar88._16_4_ + fVar156 + auVar178._16_4_ * 0.0 * 12.0 + auVar178._16_4_ * fVar228 * 6.0)
         * 0.16666667;
    auVar92._20_4_ =
         (auVar88._20_4_ + fVar157 + auVar178._20_4_ * 0.0 * 12.0 + auVar178._20_4_ * fVar229 * 6.0)
         * 0.16666667;
    auVar92._24_4_ =
         (auVar88._24_4_ + fVar158 + auVar178._24_4_ * 0.0 * 12.0 + auVar178._24_4_ * fVar230 * 6.0)
         * 0.16666667;
    auVar92._28_4_ = auVar262._28_4_;
    fVar179 = fVar179 * 0.16666667;
    fVar205 = fVar205 * 0.16666667;
    fVar206 = fVar206 * 0.16666667;
    fVar207 = fVar207 * 0.16666667;
    auVar93._28_4_ = fVar239;
    auVar93._0_28_ = ZEXT1628(CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(fVar205,fVar179))));
    auVar87 = vmulps_avx512vl(local_260,auVar93);
    auVar88 = vmulps_avx512vl(local_280,auVar93);
    auVar95._4_4_ = local_2a0._4_4_ * fVar205;
    auVar95._0_4_ = local_2a0._0_4_ * fVar179;
    auVar95._8_4_ = local_2a0._8_4_ * fVar206;
    auVar95._12_4_ = local_2a0._12_4_ * fVar207;
    auVar95._16_4_ = local_2a0._16_4_ * 0.0;
    auVar95._20_4_ = local_2a0._20_4_ * 0.0;
    auVar95._24_4_ = local_2a0._24_4_ * 0.0;
    auVar95._28_4_ = local_6e0._0_4_;
    auVar96._4_4_ = local_2c0._4_4_ * fVar205;
    auVar96._0_4_ = local_2c0._0_4_ * fVar179;
    auVar96._8_4_ = local_2c0._8_4_ * fVar206;
    auVar96._12_4_ = local_2c0._12_4_ * fVar207;
    auVar96._16_4_ = local_2c0._16_4_ * 0.0;
    auVar96._20_4_ = local_2c0._20_4_ * 0.0;
    auVar96._24_4_ = local_2c0._24_4_ * 0.0;
    auVar96._28_4_ = fVar239;
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,auVar274._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar92,auVar276._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar277._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar96,auVar278._0_32_,auVar92);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar270._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar271._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar272._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar273._0_32_,auVar91);
    auVar91 = vfmadd231ps_avx512vl(auVar87,auVar94,auVar275._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar88,auVar94,auVar267._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar268._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar90,auVar269._0_32_,auVar94);
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar89 = vxorps_avx512vl(auVar85,auVar94);
    auVar87 = vxorps_avx512vl(ZEXT1632(auVar74),auVar94);
    auVar110._0_4_ = auVar87._0_4_ * fVar252;
    auVar110._4_4_ = auVar87._4_4_ * fVar215;
    auVar110._8_4_ = auVar87._8_4_ * fVar217;
    auVar110._12_4_ = auVar87._12_4_ * fVar218;
    auVar110._16_4_ = auVar87._16_4_ * 0.0;
    auVar110._20_4_ = auVar87._20_4_ * 0.0;
    auVar110._24_4_ = auVar87._24_4_ * 0.0;
    auVar110._28_4_ = 0;
    auVar90 = vmulps_avx512vl(auVar178._0_32_,auVar86);
    auVar87 = vsubps_avx(auVar110,auVar90);
    auVar97._4_4_ = auVar89._4_4_ * fVar253 * 0.5;
    auVar97._0_4_ = auVar89._0_4_ * fVar249 * 0.5;
    auVar97._8_4_ = auVar89._8_4_ * fVar216 * 0.5;
    auVar97._12_4_ = auVar89._12_4_ * fVar238 * 0.5;
    auVar97._16_4_ = auVar89._16_4_ * fVar228 * 0.5;
    auVar97._20_4_ = auVar89._20_4_ * fVar229 * 0.5;
    auVar97._24_4_ = auVar89._24_4_ * fVar230 * 0.5;
    auVar97._28_4_ = auVar85._28_4_;
    auVar99._4_4_ = auVar87._4_4_ * 0.5;
    auVar99._0_4_ = auVar87._0_4_ * 0.5;
    auVar99._8_4_ = auVar87._8_4_ * 0.5;
    auVar99._12_4_ = auVar87._12_4_ * 0.5;
    auVar99._16_4_ = auVar87._16_4_ * 0.5;
    auVar99._20_4_ = auVar87._20_4_ * 0.5;
    auVar99._24_4_ = auVar87._24_4_ * 0.5;
    auVar99._28_4_ = auVar87._28_4_;
    auVar100._4_4_ = (auVar90._4_4_ + fVar253 * fVar253) * 0.5;
    auVar100._0_4_ = (auVar90._0_4_ + fVar249 * fVar249) * 0.5;
    auVar100._8_4_ = (auVar90._8_4_ + fVar216 * fVar216) * 0.5;
    auVar100._12_4_ = (auVar90._12_4_ + fVar238 * fVar238) * 0.5;
    auVar100._16_4_ = (auVar90._16_4_ + fVar228 * fVar228) * 0.5;
    auVar100._20_4_ = (auVar90._20_4_ + fVar229 * fVar229) * 0.5;
    auVar100._24_4_ = (auVar90._24_4_ + fVar230 * fVar230) * 0.5;
    auVar100._28_4_ = auVar90._28_4_ + auVar248._28_4_;
    fVar249 = fVar252 * fVar252 * 0.5;
    fVar239 = fVar215 * fVar215 * 0.5;
    fVar252 = fVar217 * fVar217 * 0.5;
    fVar253 = fVar218 * fVar218 * 0.5;
    auVar101._28_4_ = auVar251._28_4_;
    auVar101._0_28_ = ZEXT1628(CONCAT412(fVar253,CONCAT48(fVar252,CONCAT44(fVar239,fVar249))));
    auVar87 = vmulps_avx512vl(local_260,auVar101);
    auVar85 = vmulps_avx512vl(local_280,auVar101);
    auVar105._4_4_ = local_2a0._4_4_ * fVar239;
    auVar105._0_4_ = local_2a0._0_4_ * fVar249;
    auVar105._8_4_ = local_2a0._8_4_ * fVar252;
    auVar105._12_4_ = local_2a0._12_4_ * fVar253;
    auVar105._16_4_ = local_2a0._16_4_ * 0.0;
    auVar105._20_4_ = local_2a0._20_4_ * 0.0;
    auVar105._24_4_ = local_2a0._24_4_ * 0.0;
    auVar105._28_4_ = fVar232;
    auVar106._4_4_ = fVar239 * local_2c0._4_4_;
    auVar106._0_4_ = fVar249 * local_2c0._0_4_;
    auVar106._8_4_ = fVar252 * local_2c0._8_4_;
    auVar106._12_4_ = fVar253 * local_2c0._12_4_;
    auVar106._16_4_ = local_2c0._16_4_ * 0.0;
    auVar106._20_4_ = local_2c0._20_4_ * 0.0;
    auVar106._24_4_ = local_2c0._24_4_ * 0.0;
    auVar106._28_4_ = auVar251._28_4_;
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar100,auVar274._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,auVar276._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar105,auVar100,auVar277._0_32_);
    auVar74 = vfmadd231ps_fma(auVar106,auVar278._0_32_,auVar100);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar99,auVar270._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar99,auVar271._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar99,auVar272._0_32_);
    auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar273._0_32_,auVar99);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar97,auVar275._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar97,auVar267._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,auVar268._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar269._0_32_,auVar97);
    auVar113._4_4_ = auVar87._4_4_ * fVar231;
    auVar113._0_4_ = auVar87._0_4_ * fVar231;
    auVar113._8_4_ = auVar87._8_4_ * fVar231;
    auVar113._12_4_ = auVar87._12_4_ * fVar231;
    auVar113._16_4_ = auVar87._16_4_ * fVar231;
    auVar113._20_4_ = auVar87._20_4_ * fVar231;
    auVar113._24_4_ = auVar87._24_4_ * fVar231;
    auVar113._28_4_ = auVar278._28_4_;
    auVar262 = ZEXT3264(auVar113);
    auVar114._4_4_ = auVar85._4_4_ * fVar231;
    auVar114._0_4_ = auVar85._0_4_ * fVar231;
    auVar114._8_4_ = auVar85._8_4_ * fVar231;
    auVar114._12_4_ = auVar85._12_4_ * fVar231;
    auVar114._16_4_ = auVar85._16_4_ * fVar231;
    auVar114._20_4_ = auVar85._20_4_ * fVar231;
    auVar114._24_4_ = auVar85._24_4_ * fVar231;
    auVar114._28_4_ = 0x3e2aaaab;
    auVar115._4_4_ = auVar89._4_4_ * fVar231;
    auVar115._0_4_ = auVar89._0_4_ * fVar231;
    auVar115._8_4_ = auVar89._8_4_ * fVar231;
    auVar115._12_4_ = auVar89._12_4_ * fVar231;
    auVar115._16_4_ = auVar89._16_4_ * fVar231;
    auVar115._20_4_ = auVar89._20_4_ * fVar231;
    auVar115._24_4_ = auVar89._24_4_ * fVar231;
    auVar115._28_4_ = 0x40c00000;
    fVar249 = auVar90._0_4_ * fVar231;
    fVar239 = auVar90._4_4_ * fVar231;
    auVar107._4_4_ = fVar239;
    auVar107._0_4_ = fVar249;
    fVar252 = auVar90._8_4_ * fVar231;
    auVar107._8_4_ = fVar252;
    fVar253 = auVar90._12_4_ * fVar231;
    auVar107._12_4_ = fVar253;
    fVar215 = auVar90._16_4_ * fVar231;
    auVar107._16_4_ = fVar215;
    fVar216 = auVar90._20_4_ * fVar231;
    auVar107._20_4_ = fVar216;
    fVar217 = auVar90._24_4_ * fVar231;
    auVar107._24_4_ = fVar217;
    auVar107._28_4_ = fVar231;
    auVar74 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
    auVar95 = vpermt2ps_avx512vl(auVar91,_DAT_01feed00,ZEXT1632(auVar74));
    auVar254 = ZEXT3264(auVar95);
    auVar96 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,ZEXT1632(auVar74));
    auVar85 = ZEXT1632(auVar74);
    auVar97 = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,auVar85);
    auVar257 = ZEXT3264(auVar97);
    auVar227._0_4_ = fVar249 + auVar88._0_4_;
    auVar227._4_4_ = fVar239 + auVar88._4_4_;
    auVar227._8_4_ = fVar252 + auVar88._8_4_;
    auVar227._12_4_ = fVar253 + auVar88._12_4_;
    auVar227._16_4_ = fVar215 + auVar88._16_4_;
    auVar227._20_4_ = fVar216 + auVar88._20_4_;
    auVar227._24_4_ = fVar217 + auVar88._24_4_;
    auVar227._28_4_ = fVar231 + auVar88._28_4_;
    auVar87 = vmaxps_avx(auVar88,auVar227);
    auVar84 = vminps_avx(auVar88,auVar227);
    auVar98 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,auVar85);
    auVar99 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,auVar85);
    auVar251 = ZEXT3264(auVar99);
    auVar100 = vpermt2ps_avx512vl(auVar114,_DAT_01feed00,auVar85);
    auVar227 = ZEXT1632(auVar74);
    auVar101 = vpermt2ps_avx512vl(auVar115,_DAT_01feed00,auVar227);
    auVar85 = vpermt2ps_avx512vl(auVar107,_DAT_01feed00,auVar227);
    auVar102 = vsubps_avx512vl(auVar98,auVar85);
    auVar85 = vsubps_avx(auVar95,auVar91);
    auVar248 = ZEXT3264(auVar85);
    auVar88 = vsubps_avx(auVar96,auVar92);
    auVar89 = vsubps_avx(auVar97,auVar93);
    auVar90 = vmulps_avx512vl(auVar88,auVar115);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar114,auVar89);
    auVar103 = vmulps_avx512vl(auVar89,auVar113);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar115,auVar85);
    auVar104 = vmulps_avx512vl(auVar85,auVar114);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar113,auVar88);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar90,auVar90);
    auVar90 = vmulps_avx512vl(auVar89,auVar89);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar88);
    auVar104 = vfmadd231ps_avx512vl(auVar90,auVar85,auVar85);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar90._8_4_ = 0x3f800000;
    auVar90._0_8_ = 0x3f8000003f800000;
    auVar90._12_4_ = 0x3f800000;
    auVar90._16_4_ = 0x3f800000;
    auVar90._20_4_ = 0x3f800000;
    auVar90._24_4_ = 0x3f800000;
    auVar90._28_4_ = 0x3f800000;
    auVar90 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar90);
    auVar90 = vfmadd132ps_avx512vl(auVar90,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar90);
    auVar105 = vmulps_avx512vl(auVar88,auVar101);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar100,auVar89);
    auVar106 = vmulps_avx512vl(auVar89,auVar99);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar101,auVar85);
    auVar107 = vmulps_avx512vl(auVar85,auVar100);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar99,auVar88);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar90 = vmulps_avx512vl(auVar105,auVar90);
    auVar90 = vmaxps_avx512vl(auVar103,auVar90);
    auVar90 = vsqrtps_avx512vl(auVar90);
    auVar103 = vmaxps_avx512vl(auVar102,auVar98);
    auVar87 = vmaxps_avx512vl(auVar87,auVar103);
    auVar105 = vaddps_avx512vl(auVar90,auVar87);
    auVar87 = vminps_avx512vl(auVar102,auVar98);
    auVar87 = vminps_avx(auVar84,auVar87);
    auVar87 = vsubps_avx512vl(auVar87,auVar90);
    auVar98._8_4_ = 0x3f800002;
    auVar98._0_8_ = 0x3f8000023f800002;
    auVar98._12_4_ = 0x3f800002;
    auVar98._16_4_ = 0x3f800002;
    auVar98._20_4_ = 0x3f800002;
    auVar98._24_4_ = 0x3f800002;
    auVar98._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar105,auVar98);
    auVar102._8_4_ = 0x3f7ffffc;
    auVar102._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar102._12_4_ = 0x3f7ffffc;
    auVar102._16_4_ = 0x3f7ffffc;
    auVar102._20_4_ = 0x3f7ffffc;
    auVar102._24_4_ = 0x3f7ffffc;
    auVar102._28_4_ = 0x3f7ffffc;
    auVar87 = vmulps_avx512vl(auVar87,auVar102);
    auVar84 = vmulps_avx512vl(auVar84,auVar84);
    auVar90 = vrsqrt14ps_avx512vl(auVar104);
    auVar103._8_4_ = 0xbf000000;
    auVar103._0_8_ = 0xbf000000bf000000;
    auVar103._12_4_ = 0xbf000000;
    auVar103._16_4_ = 0xbf000000;
    auVar103._20_4_ = 0xbf000000;
    auVar103._24_4_ = 0xbf000000;
    auVar103._28_4_ = 0xbf000000;
    auVar98 = vmulps_avx512vl(auVar104,auVar103);
    fVar249 = auVar90._0_4_;
    fVar239 = auVar90._4_4_;
    fVar252 = auVar90._8_4_;
    fVar253 = auVar90._12_4_;
    fVar215 = auVar90._16_4_;
    fVar216 = auVar90._20_4_;
    fVar217 = auVar90._24_4_;
    auVar108._4_4_ = fVar239 * fVar239 * fVar239 * auVar98._4_4_;
    auVar108._0_4_ = fVar249 * fVar249 * fVar249 * auVar98._0_4_;
    auVar108._8_4_ = fVar252 * fVar252 * fVar252 * auVar98._8_4_;
    auVar108._12_4_ = fVar253 * fVar253 * fVar253 * auVar98._12_4_;
    auVar108._16_4_ = fVar215 * fVar215 * fVar215 * auVar98._16_4_;
    auVar108._20_4_ = fVar216 * fVar216 * fVar216 * auVar98._20_4_;
    auVar108._24_4_ = fVar217 * fVar217 * fVar217 * auVar98._24_4_;
    auVar108._28_4_ = auVar105._28_4_;
    auVar104._8_4_ = 0x3fc00000;
    auVar104._0_8_ = 0x3fc000003fc00000;
    auVar104._12_4_ = 0x3fc00000;
    auVar104._16_4_ = 0x3fc00000;
    auVar104._20_4_ = 0x3fc00000;
    auVar104._24_4_ = 0x3fc00000;
    auVar104._28_4_ = 0x3fc00000;
    auVar90 = vfmadd231ps_avx512vl(auVar108,auVar90,auVar104);
    auVar98 = vmulps_avx512vl(auVar85,auVar90);
    auVar102 = vmulps_avx512vl(auVar88,auVar90);
    auVar103 = vmulps_avx512vl(auVar89,auVar90);
    auVar104 = vsubps_avx512vl(auVar227,auVar91);
    auVar105 = vsubps_avx512vl(auVar227,auVar92);
    auVar106 = vsubps_avx512vl(auVar227,auVar93);
    auVar107 = vmulps_avx512vl(local_440,auVar106);
    auVar107 = vfmadd231ps_avx512vl(auVar107,local_420,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,_local_400,auVar104);
    auVar108 = vmulps_avx512vl(auVar106,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar105);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar104);
    auVar109 = vmulps_avx512vl(local_440,auVar103);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar102,local_420);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar98,_local_400);
    auVar103 = vmulps_avx512vl(auVar106,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar102);
    auVar98 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar98);
    auVar102 = vmulps_avx512vl(auVar109,auVar109);
    auVar103 = vsubps_avx512vl(local_220,auVar102);
    auVar110 = vmulps_avx512vl(auVar109,auVar98);
    auVar107 = vsubps_avx512vl(auVar107,auVar110);
    auVar107 = vaddps_avx512vl(auVar107,auVar107);
    auVar110 = vmulps_avx512vl(auVar98,auVar98);
    local_700 = vsubps_avx512vl(auVar108,auVar110);
    auVar84 = vsubps_avx512vl(local_700,auVar84);
    local_7a0 = vmulps_avx512vl(auVar107,auVar107);
    _local_7c0 = vmulps_avx512vl(auVar103,auVar86);
    auVar108 = vmulps_avx512vl(_local_7c0,auVar84);
    auVar108 = vsubps_avx512vl(local_7a0,auVar108);
    auVar74 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
    uVar67 = vcmpps_avx512vl(auVar108,auVar227,5);
    bVar56 = (byte)uVar67;
    fVar249 = (float)local_9a0._0_4_;
    fVar252 = (float)local_9a0._4_4_;
    fVar253 = fStack_998;
    fVar215 = fStack_994;
    fVar216 = fStack_990;
    fVar217 = fStack_98c;
    fVar238 = fStack_988;
    fVar239 = fStack_984;
    if (bVar56 == 0) {
LAB_01ba228c:
      auVar275 = ZEXT3264(local_8c0);
      auVar267 = ZEXT3264(local_8e0);
      auVar268 = ZEXT3264(local_900);
      auVar269 = ZEXT3264(local_920);
      auVar270 = ZEXT3264(local_800);
      auVar271 = ZEXT3264(local_940);
      auVar272 = ZEXT3264(local_820);
      auVar273 = ZEXT3264(local_960);
      auVar274 = ZEXT3264(local_980);
      auVar276 = ZEXT3264(local_840);
      auVar277 = ZEXT3264(local_860);
      auVar278 = ZEXT3264(local_8a0);
    }
    else {
      auVar108 = vsqrtps_avx512vl(auVar108);
      auVar110 = vaddps_avx512vl(auVar103,auVar103);
      _local_560 = vrcp14ps_avx512vl(auVar110);
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = 0x3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar86._16_4_ = 0x3f800000;
      auVar86._20_4_ = 0x3f800000;
      auVar86._24_4_ = 0x3f800000;
      auVar86._28_4_ = 0x3f800000;
      auVar86 = vfnmadd213ps_avx512vl(_local_560,auVar110,auVar86);
      auVar86 = vfmadd132ps_avx512vl(auVar86,_local_560,_local_560);
      local_580 = vxorps_avx512vl(auVar107,auVar94);
      auVar94 = vsubps_avx512vl(local_580,auVar108);
      local_7e0 = vmulps_avx512vl(auVar94,auVar86);
      auVar94 = vsubps_avx512vl(auVar108,auVar107);
      local_540 = vmulps_avx512vl(auVar94,auVar86);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar108 = vblendmps_avx512vl(auVar94,local_7e0);
      auVar111._0_4_ =
           (uint)(bVar56 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar94._0_4_;
      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar66 * auVar108._4_4_ | (uint)!bVar66 * auVar94._4_4_;
      bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar66 * auVar108._8_4_ | (uint)!bVar66 * auVar94._8_4_;
      bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar66 * auVar108._12_4_ | (uint)!bVar66 * auVar94._12_4_;
      bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar66 * auVar108._16_4_ | (uint)!bVar66 * auVar94._16_4_;
      bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar66 * auVar108._20_4_ | (uint)!bVar66 * auVar94._20_4_;
      bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar66 * auVar108._24_4_ | (uint)!bVar66 * auVar94._24_4_;
      bVar66 = SUB81(uVar67 >> 7,0);
      auVar111._28_4_ = (uint)bVar66 * auVar108._28_4_ | (uint)!bVar66 * auVar94._28_4_;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar108 = vblendmps_avx512vl(auVar94,local_540);
      auVar112._0_4_ =
           (uint)(bVar56 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar94._0_4_;
      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar66 * auVar108._4_4_ | (uint)!bVar66 * auVar94._4_4_;
      bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar66 * auVar108._8_4_ | (uint)!bVar66 * auVar94._8_4_;
      bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar66 * auVar108._12_4_ | (uint)!bVar66 * auVar94._12_4_;
      bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar66 * auVar108._16_4_ | (uint)!bVar66 * auVar94._16_4_;
      bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar66 * auVar108._20_4_ | (uint)!bVar66 * auVar94._20_4_;
      bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar66 * auVar108._24_4_ | (uint)!bVar66 * auVar94._24_4_;
      bVar66 = SUB81(uVar67 >> 7,0);
      auVar112._28_4_ = (uint)bVar66 * auVar108._28_4_ | (uint)!bVar66 * auVar94._28_4_;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar102,auVar94);
      local_5a0 = vmaxps_avx512vl(local_240,auVar94);
      auVar33._8_4_ = 0x36000000;
      auVar33._0_8_ = 0x3600000036000000;
      auVar33._12_4_ = 0x36000000;
      auVar33._16_4_ = 0x36000000;
      auVar33._20_4_ = 0x36000000;
      auVar33._24_4_ = 0x36000000;
      auVar33._28_4_ = 0x36000000;
      local_5c0 = vmulps_avx512vl(local_5a0,auVar33);
      vandps_avx512vl(auVar103,auVar94);
      uVar68 = vcmpps_avx512vl(local_5c0,local_5c0,1);
      uVar67 = uVar67 & uVar68;
      bVar60 = (byte)uVar67;
      if (bVar60 != 0) {
        uVar68 = vcmpps_avx512vl(auVar84,ZEXT1632(auVar74),2);
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar103 = vblendmps_avx512vl(auVar84,auVar102);
        bVar63 = (byte)uVar68;
        uVar61 = (uint)(bVar63 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar63 & 1) * local_5c0._0_4_;
        bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
        uVar69 = (uint)bVar66 * auVar103._4_4_ | (uint)!bVar66 * local_5c0._4_4_;
        bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
        uVar127 = (uint)bVar66 * auVar103._8_4_ | (uint)!bVar66 * local_5c0._8_4_;
        bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
        uVar128 = (uint)bVar66 * auVar103._12_4_ | (uint)!bVar66 * local_5c0._12_4_;
        bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
        uVar129 = (uint)bVar66 * auVar103._16_4_ | (uint)!bVar66 * local_5c0._16_4_;
        bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
        uVar130 = (uint)bVar66 * auVar103._20_4_ | (uint)!bVar66 * local_5c0._20_4_;
        bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
        uVar131 = (uint)bVar66 * auVar103._24_4_ | (uint)!bVar66 * local_5c0._24_4_;
        bVar66 = SUB81(uVar68 >> 7,0);
        uVar132 = (uint)bVar66 * auVar103._28_4_ | (uint)!bVar66 * local_5c0._28_4_;
        auVar111._0_4_ = (bVar60 & 1) * uVar61 | !(bool)(bVar60 & 1) * auVar111._0_4_;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar111._4_4_ = bVar66 * uVar69 | !bVar66 * auVar111._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar111._8_4_ = bVar66 * uVar127 | !bVar66 * auVar111._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar111._12_4_ = bVar66 * uVar128 | !bVar66 * auVar111._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar111._16_4_ = bVar66 * uVar129 | !bVar66 * auVar111._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar111._20_4_ = bVar66 * uVar130 | !bVar66 * auVar111._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar111._24_4_ = bVar66 * uVar131 | !bVar66 * auVar111._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar111._28_4_ = bVar66 * uVar132 | !bVar66 * auVar111._28_4_;
        auVar84 = vblendmps_avx512vl(auVar102,auVar84);
        bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar68 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar68 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar68 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar68 >> 6) & 1);
        bVar14 = SUB81(uVar68 >> 7,0);
        auVar112._0_4_ =
             (uint)(bVar60 & 1) *
             ((uint)(bVar63 & 1) * auVar84._0_4_ | !(bool)(bVar63 & 1) * uVar61) |
             !(bool)(bVar60 & 1) * auVar112._0_4_;
        bVar8 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar112._4_4_ =
             (uint)bVar8 * ((uint)bVar66 * auVar84._4_4_ | !bVar66 * uVar69) |
             !bVar8 * auVar112._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar112._8_4_ =
             (uint)bVar66 * ((uint)bVar9 * auVar84._8_4_ | !bVar9 * uVar127) |
             !bVar66 * auVar112._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar112._12_4_ =
             (uint)bVar66 * ((uint)bVar10 * auVar84._12_4_ | !bVar10 * uVar128) |
             !bVar66 * auVar112._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar112._16_4_ =
             (uint)bVar66 * ((uint)bVar11 * auVar84._16_4_ | !bVar11 * uVar129) |
             !bVar66 * auVar112._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar112._20_4_ =
             (uint)bVar66 * ((uint)bVar12 * auVar84._20_4_ | !bVar12 * uVar130) |
             !bVar66 * auVar112._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar112._24_4_ =
             (uint)bVar66 * ((uint)bVar13 * auVar84._24_4_ | !bVar13 * uVar131) |
             !bVar66 * auVar112._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar112._28_4_ =
             (uint)bVar66 * ((uint)bVar14 * auVar84._28_4_ | !bVar14 * uVar132) |
             !bVar66 * auVar112._28_4_;
        bVar56 = (~bVar60 | bVar63) & bVar56;
      }
      auVar278 = ZEXT3264(local_8a0);
      if ((bVar56 & 0x7f) == 0) {
        auVar275 = ZEXT3264(local_8c0);
        auVar267 = ZEXT3264(local_8e0);
        auVar268 = ZEXT3264(local_900);
        auVar269 = ZEXT3264(local_920);
        auVar270 = ZEXT3264(local_800);
        auVar271 = ZEXT3264(local_940);
        auVar272 = ZEXT3264(local_820);
        auVar273 = ZEXT3264(local_960);
        auVar274 = ZEXT3264(local_980);
        auVar276 = ZEXT3264(local_840);
        auVar277 = ZEXT3264(local_860);
      }
      else {
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar102 = vxorps_avx512vl(auVar101,auVar84);
        auVar103 = vxorps_avx512vl(auVar99,auVar84);
        uVar61 = *(uint *)(ray + k * 4 + 0x80);
        auVar94 = vxorps_avx512vl(auVar100,auVar84);
        auVar74 = vsubss_avx512f(ZEXT416(uVar61),ZEXT416((uint)local_620._0_4_));
        auVar99 = vbroadcastss_avx512vl(auVar74);
        auVar99 = vminps_avx512vl(auVar99,auVar112);
        auVar55._4_4_ = fStack_2dc;
        auVar55._0_4_ = local_2e0;
        auVar55._8_4_ = fStack_2d8;
        auVar55._12_4_ = fStack_2d4;
        auVar55._16_4_ = fStack_2d0;
        auVar55._20_4_ = fStack_2cc;
        auVar55._24_4_ = fStack_2c8;
        auVar55._28_4_ = fStack_2c4;
        auVar100 = vmaxps_avx512vl(auVar55,auVar111);
        auVar101 = vmulps_avx512vl(auVar115,auVar106);
        auVar101 = vfmadd213ps_avx512vl(auVar105,auVar114,auVar101);
        auVar74 = vfmadd213ps_fma(auVar104,auVar113,auVar101);
        auVar104 = vmulps_avx512vl(local_440,auVar115);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_420,auVar114);
        auVar73 = vfmadd231ps_fma(auVar104,_local_400,auVar113);
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar73),auVar104);
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar15 = vcmpps_avx512vl(auVar104,auVar101,1);
        auVar105 = vxorps_avx512vl(ZEXT1632(auVar74),auVar84);
        auVar106 = vrcp14ps_avx512vl(ZEXT1632(auVar73));
        auVar86 = ZEXT1632(auVar73);
        auVar113 = vxorps_avx512vl(auVar86,auVar84);
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar115 = vfnmadd213ps_avx512vl(auVar106,auVar86,auVar114);
        auVar74 = vfmadd132ps_fma(auVar115,auVar106,auVar106);
        fVar218 = auVar74._0_4_ * auVar105._0_4_;
        fVar228 = auVar74._4_4_ * auVar105._4_4_;
        auVar38._4_4_ = fVar228;
        auVar38._0_4_ = fVar218;
        fVar229 = auVar74._8_4_ * auVar105._8_4_;
        auVar38._8_4_ = fVar229;
        fVar230 = auVar74._12_4_ * auVar105._12_4_;
        auVar38._12_4_ = fVar230;
        fVar231 = auVar105._16_4_ * 0.0;
        auVar38._16_4_ = fVar231;
        fVar232 = auVar105._20_4_ * 0.0;
        auVar38._20_4_ = fVar232;
        fVar134 = auVar105._24_4_ * 0.0;
        auVar38._24_4_ = fVar134;
        auVar38._28_4_ = auVar105._28_4_;
        uVar16 = vcmpps_avx512vl(auVar86,auVar113,1);
        bVar60 = (byte)uVar15 | (byte)uVar16;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar108 = vblendmps_avx512vl(auVar38,auVar115);
        auVar116._0_4_ =
             (uint)(bVar60 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar106._0_4_;
        bVar66 = (bool)(bVar60 >> 1 & 1);
        auVar116._4_4_ = (uint)bVar66 * auVar108._4_4_ | (uint)!bVar66 * auVar106._4_4_;
        bVar66 = (bool)(bVar60 >> 2 & 1);
        auVar116._8_4_ = (uint)bVar66 * auVar108._8_4_ | (uint)!bVar66 * auVar106._8_4_;
        bVar66 = (bool)(bVar60 >> 3 & 1);
        auVar116._12_4_ = (uint)bVar66 * auVar108._12_4_ | (uint)!bVar66 * auVar106._12_4_;
        bVar66 = (bool)(bVar60 >> 4 & 1);
        auVar116._16_4_ = (uint)bVar66 * auVar108._16_4_ | (uint)!bVar66 * auVar106._16_4_;
        bVar66 = (bool)(bVar60 >> 5 & 1);
        auVar116._20_4_ = (uint)bVar66 * auVar108._20_4_ | (uint)!bVar66 * auVar106._20_4_;
        bVar66 = (bool)(bVar60 >> 6 & 1);
        auVar116._24_4_ = (uint)bVar66 * auVar108._24_4_ | (uint)!bVar66 * auVar106._24_4_;
        auVar116._28_4_ =
             (uint)(bVar60 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar60 >> 7) * auVar106._28_4_;
        auVar106 = vmaxps_avx512vl(auVar100,auVar116);
        auVar262 = ZEXT3264(auVar106);
        uVar16 = vcmpps_avx512vl(auVar86,auVar113,6);
        bVar60 = (byte)uVar15 | (byte)uVar16;
        auVar117._0_4_ = (uint)(bVar60 & 1) * 0x7f800000 | (uint)!(bool)(bVar60 & 1) * (int)fVar218;
        bVar66 = (bool)(bVar60 >> 1 & 1);
        auVar117._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar228;
        bVar66 = (bool)(bVar60 >> 2 & 1);
        auVar117._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar229;
        bVar66 = (bool)(bVar60 >> 3 & 1);
        auVar117._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar230;
        bVar66 = (bool)(bVar60 >> 4 & 1);
        auVar117._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar231;
        bVar66 = (bool)(bVar60 >> 5 & 1);
        auVar117._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar232;
        bVar66 = (bool)(bVar60 >> 6 & 1);
        auVar117._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar134;
        auVar117._28_4_ =
             (uint)(bVar60 >> 7) * 0x7f800000 | (uint)!(bool)(bVar60 >> 7) * auVar105._28_4_;
        auVar105 = vminps_avx512vl(auVar99,auVar117);
        auVar74 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
        auVar95 = vsubps_avx512vl(ZEXT1632(auVar74),auVar95);
        auVar96 = vsubps_avx512vl(ZEXT1632(auVar74),auVar96);
        auVar100 = ZEXT1632(auVar74);
        auVar97 = vsubps_avx512vl(auVar100,auVar97);
        auVar97 = vmulps_avx512vl(auVar97,auVar102);
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar96);
        auVar95 = vfmadd231ps_avx512vl(auVar96,auVar103,auVar95);
        auVar102 = vmulps_avx512vl(local_440,auVar102);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_420,auVar94);
        auVar102 = vfmadd231ps_avx512vl(auVar102,_local_400,auVar103);
        vandps_avx512vl(auVar102,auVar104);
        uVar15 = vcmpps_avx512vl(auVar102,auVar101,1);
        auVar103 = vxorps_avx512vl(auVar95,auVar84);
        auVar104 = vrcp14ps_avx512vl(auVar102);
        auVar84 = vxorps_avx512vl(auVar102,auVar84);
        auVar257 = ZEXT3264(auVar84);
        auVar94 = vfnmadd213ps_avx512vl(auVar104,auVar102,auVar114);
        auVar74 = vfmadd132ps_fma(auVar94,auVar104,auVar104);
        fVar218 = auVar74._0_4_ * auVar103._0_4_;
        fVar228 = auVar74._4_4_ * auVar103._4_4_;
        auVar39._4_4_ = fVar228;
        auVar39._0_4_ = fVar218;
        fVar229 = auVar74._8_4_ * auVar103._8_4_;
        auVar39._8_4_ = fVar229;
        fVar230 = auVar74._12_4_ * auVar103._12_4_;
        auVar39._12_4_ = fVar230;
        fVar231 = auVar103._16_4_ * 0.0;
        auVar39._16_4_ = fVar231;
        fVar232 = auVar103._20_4_ * 0.0;
        auVar39._20_4_ = fVar232;
        fVar134 = auVar103._24_4_ * 0.0;
        auVar39._24_4_ = fVar134;
        auVar39._28_4_ = auVar103._28_4_;
        uVar16 = vcmpps_avx512vl(auVar102,auVar84,1);
        bVar60 = (byte)uVar15 | (byte)uVar16;
        auVar94 = vblendmps_avx512vl(auVar39,auVar115);
        auVar118._0_4_ =
             (uint)(bVar60 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar104._0_4_;
        bVar66 = (bool)(bVar60 >> 1 & 1);
        auVar118._4_4_ = (uint)bVar66 * auVar94._4_4_ | (uint)!bVar66 * auVar104._4_4_;
        bVar66 = (bool)(bVar60 >> 2 & 1);
        auVar118._8_4_ = (uint)bVar66 * auVar94._8_4_ | (uint)!bVar66 * auVar104._8_4_;
        bVar66 = (bool)(bVar60 >> 3 & 1);
        auVar118._12_4_ = (uint)bVar66 * auVar94._12_4_ | (uint)!bVar66 * auVar104._12_4_;
        bVar66 = (bool)(bVar60 >> 4 & 1);
        auVar118._16_4_ = (uint)bVar66 * auVar94._16_4_ | (uint)!bVar66 * auVar104._16_4_;
        bVar66 = (bool)(bVar60 >> 5 & 1);
        auVar118._20_4_ = (uint)bVar66 * auVar94._20_4_ | (uint)!bVar66 * auVar104._20_4_;
        bVar66 = (bool)(bVar60 >> 6 & 1);
        auVar118._24_4_ = (uint)bVar66 * auVar94._24_4_ | (uint)!bVar66 * auVar104._24_4_;
        auVar118._28_4_ =
             (uint)(bVar60 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar60 >> 7) * auVar104._28_4_;
        _local_720 = vmaxps_avx(auVar106,auVar118);
        auVar251 = ZEXT3264(_local_720);
        uVar16 = vcmpps_avx512vl(auVar102,auVar84,6);
        bVar60 = (byte)uVar15 | (byte)uVar16;
        auVar119._0_4_ = (uint)(bVar60 & 1) * 0x7f800000 | (uint)!(bool)(bVar60 & 1) * (int)fVar218;
        bVar66 = (bool)(bVar60 >> 1 & 1);
        auVar119._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar228;
        bVar66 = (bool)(bVar60 >> 2 & 1);
        auVar119._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar229;
        bVar66 = (bool)(bVar60 >> 3 & 1);
        auVar119._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar230;
        bVar66 = (bool)(bVar60 >> 4 & 1);
        auVar119._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar231;
        bVar66 = (bool)(bVar60 >> 5 & 1);
        auVar119._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar232;
        bVar66 = (bool)(bVar60 >> 6 & 1);
        auVar119._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar134;
        auVar119._28_4_ =
             (uint)(bVar60 >> 7) * 0x7f800000 | (uint)!(bool)(bVar60 >> 7) * auVar103._28_4_;
        local_340 = vminps_avx(auVar105,auVar119);
        auVar254 = ZEXT3264(local_340);
        uVar15 = vcmpps_avx512vl(_local_720,local_340,2);
        bVar56 = bVar56 & 0x7f & (byte)uVar15;
        if (bVar56 == 0) goto LAB_01ba228c;
        auVar84 = vmaxps_avx512vl(auVar100,auVar87);
        auVar87 = vfmadd213ps_avx512vl(local_7e0,auVar109,auVar98);
        fVar218 = auVar90._0_4_;
        fVar228 = auVar90._4_4_;
        auVar40._4_4_ = fVar228 * auVar87._4_4_;
        auVar40._0_4_ = fVar218 * auVar87._0_4_;
        fVar229 = auVar90._8_4_;
        auVar40._8_4_ = fVar229 * auVar87._8_4_;
        fVar230 = auVar90._12_4_;
        auVar40._12_4_ = fVar230 * auVar87._12_4_;
        fVar231 = auVar90._16_4_;
        auVar40._16_4_ = fVar231 * auVar87._16_4_;
        fVar232 = auVar90._20_4_;
        auVar40._20_4_ = fVar232 * auVar87._20_4_;
        fVar134 = auVar90._24_4_;
        auVar40._24_4_ = fVar134 * auVar87._24_4_;
        auVar40._28_4_ = auVar87._28_4_;
        auVar87 = vfmadd213ps_avx512vl(local_540,auVar109,auVar98);
        auVar41._4_4_ = fVar228 * auVar87._4_4_;
        auVar41._0_4_ = fVar218 * auVar87._0_4_;
        auVar41._8_4_ = fVar229 * auVar87._8_4_;
        auVar41._12_4_ = fVar230 * auVar87._12_4_;
        auVar41._16_4_ = fVar231 * auVar87._16_4_;
        auVar41._20_4_ = fVar232 * auVar87._20_4_;
        auVar41._24_4_ = fVar134 * auVar87._24_4_;
        auVar41._28_4_ = auVar118._28_4_;
        auVar87 = vminps_avx512vl(auVar40,auVar114);
        auVar50 = ZEXT812(0);
        auVar102 = ZEXT1232(auVar50) << 0x20;
        auVar87 = vmaxps_avx(auVar87,ZEXT1232(auVar50) << 0x20);
        auVar103 = vminps_avx512vl(auVar41,auVar114);
        auVar42._4_4_ = (auVar87._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar87._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar87._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar87._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar87._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar87._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar87._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar87._28_4_ + 7.0;
        auVar74 = vfmadd213ps_fma(auVar42,local_6e0,local_880);
        local_1e0 = ZEXT1632(auVar74);
        auVar87 = vmaxps_avx(auVar103,ZEXT1232(auVar50) << 0x20);
        auVar43._4_4_ = (auVar87._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar87._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar87._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar87._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar87._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar87._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar87._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar87._28_4_ + 7.0;
        auVar74 = vfmadd213ps_fma(auVar43,local_6e0,local_880);
        local_200 = ZEXT1632(auVar74);
        auVar44._4_4_ = auVar84._4_4_ * auVar84._4_4_;
        auVar44._0_4_ = auVar84._0_4_ * auVar84._0_4_;
        auVar44._8_4_ = auVar84._8_4_ * auVar84._8_4_;
        auVar44._12_4_ = auVar84._12_4_ * auVar84._12_4_;
        auVar44._16_4_ = auVar84._16_4_ * auVar84._16_4_;
        auVar44._20_4_ = auVar84._20_4_ * auVar84._20_4_;
        auVar44._24_4_ = auVar84._24_4_ * auVar84._24_4_;
        auVar44._28_4_ = auVar84._28_4_;
        auVar87 = vsubps_avx(local_700,auVar44);
        auVar45._4_4_ = auVar87._4_4_ * (float)local_7c0._4_4_;
        auVar45._0_4_ = auVar87._0_4_ * (float)local_7c0._0_4_;
        auVar45._8_4_ = auVar87._8_4_ * fStack_7b8;
        auVar45._12_4_ = auVar87._12_4_ * fStack_7b4;
        auVar45._16_4_ = auVar87._16_4_ * fStack_7b0;
        auVar45._20_4_ = auVar87._20_4_ * fStack_7ac;
        auVar45._24_4_ = auVar87._24_4_ * fStack_7a8;
        auVar45._28_4_ = auVar84._28_4_;
        auVar84 = vsubps_avx(local_7a0,auVar45);
        uVar67 = vcmpps_avx512vl(auVar84,ZEXT1232(auVar50) << 0x20,5);
        auVar276 = ZEXT3264(local_840);
        auVar277 = ZEXT3264(local_860);
        auVar278 = ZEXT3264(local_8a0);
        if ((byte)uVar67 == 0) {
          uVar67 = 0;
          auVar85 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar178 = ZEXT864(0) << 0x20;
          auVar84 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar255 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar120._8_4_ = 0x7f800000;
          auVar120._0_8_ = 0x7f8000007f800000;
          auVar120._12_4_ = 0x7f800000;
          auVar120._16_4_ = 0x7f800000;
          auVar120._20_4_ = 0x7f800000;
          auVar120._24_4_ = 0x7f800000;
          auVar120._28_4_ = 0x7f800000;
          auVar121._8_4_ = 0xff800000;
          auVar121._0_8_ = 0xff800000ff800000;
          auVar121._12_4_ = 0xff800000;
          auVar121._16_4_ = 0xff800000;
          auVar121._20_4_ = 0xff800000;
          auVar121._24_4_ = 0xff800000;
          auVar121._28_4_ = 0xff800000;
        }
        else {
          auVar73 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
          uVar68 = vcmpps_avx512vl(auVar84,auVar100,5);
          auVar84 = vsqrtps_avx(auVar84);
          auVar102 = vfnmadd213ps_avx512vl(auVar110,_local_560,auVar114);
          auVar104 = vfmadd132ps_avx512vl(auVar102,_local_560,_local_560);
          auVar102 = vsubps_avx(local_580,auVar84);
          auVar94 = vmulps_avx512vl(auVar102,auVar104);
          auVar84 = vsubps_avx512vl(auVar84,auVar107);
          auVar104 = vmulps_avx512vl(auVar84,auVar104);
          auVar84 = vfmadd213ps_avx512vl(auVar109,auVar94,auVar98);
          auVar46._4_4_ = fVar228 * auVar84._4_4_;
          auVar46._0_4_ = fVar218 * auVar84._0_4_;
          auVar46._8_4_ = fVar229 * auVar84._8_4_;
          auVar46._12_4_ = fVar230 * auVar84._12_4_;
          auVar46._16_4_ = fVar231 * auVar84._16_4_;
          auVar46._20_4_ = fVar232 * auVar84._20_4_;
          auVar46._24_4_ = fVar134 * auVar84._24_4_;
          auVar46._28_4_ = auVar103._28_4_;
          auVar47._4_4_ = (float)local_400._4_4_ * auVar94._4_4_;
          auVar47._0_4_ = (float)local_400._0_4_ * auVar94._0_4_;
          auVar47._8_4_ = fStack_3f8 * auVar94._8_4_;
          auVar47._12_4_ = fStack_3f4 * auVar94._12_4_;
          auVar47._16_4_ = fStack_3f0 * auVar94._16_4_;
          auVar47._20_4_ = fStack_3ec * auVar94._20_4_;
          auVar47._24_4_ = fStack_3e8 * auVar94._24_4_;
          auVar47._28_4_ = auVar84._28_4_;
          auVar102 = vmulps_avx512vl(local_420,auVar94);
          auVar95 = vmulps_avx512vl(local_440,auVar94);
          auVar84 = vfmadd213ps_avx512vl(auVar85,auVar46,auVar91);
          auVar84 = vsubps_avx512vl(auVar47,auVar84);
          auVar103 = vfmadd213ps_avx512vl(auVar88,auVar46,auVar92);
          auVar103 = vsubps_avx512vl(auVar102,auVar103);
          auVar74 = vfmadd213ps_fma(auVar46,auVar89,auVar93);
          auVar102 = vsubps_avx(auVar95,ZEXT1632(auVar74));
          auVar255 = auVar102._0_28_;
          auVar98 = vfmadd213ps_avx512vl(auVar109,auVar104,auVar98);
          auVar90 = vmulps_avx512vl(auVar90,auVar98);
          auVar48._4_4_ = (float)local_400._4_4_ * auVar104._4_4_;
          auVar48._0_4_ = (float)local_400._0_4_ * auVar104._0_4_;
          auVar48._8_4_ = fStack_3f8 * auVar104._8_4_;
          auVar48._12_4_ = fStack_3f4 * auVar104._12_4_;
          auVar48._16_4_ = fStack_3f0 * auVar104._16_4_;
          auVar48._20_4_ = fStack_3ec * auVar104._20_4_;
          auVar48._24_4_ = fStack_3e8 * auVar104._24_4_;
          auVar48._28_4_ = auVar95._28_4_;
          auVar98 = vmulps_avx512vl(local_420,auVar104);
          auVar95 = vmulps_avx512vl(local_440,auVar104);
          auVar74 = vfmadd213ps_fma(auVar85,auVar90,auVar91);
          auVar102 = vsubps_avx(auVar48,ZEXT1632(auVar74));
          auVar74 = vfmadd213ps_fma(auVar88,auVar90,auVar92);
          auVar85 = vsubps_avx512vl(auVar98,ZEXT1632(auVar74));
          auVar74 = vfmadd213ps_fma(auVar89,auVar90,auVar93);
          auVar88 = vsubps_avx512vl(auVar95,ZEXT1632(auVar74));
          auVar178 = ZEXT3264(auVar88);
          auVar146._8_4_ = 0x7f800000;
          auVar146._0_8_ = 0x7f8000007f800000;
          auVar146._12_4_ = 0x7f800000;
          auVar146._16_4_ = 0x7f800000;
          auVar146._20_4_ = 0x7f800000;
          auVar146._24_4_ = 0x7f800000;
          auVar146._28_4_ = 0x7f800000;
          auVar88 = vblendmps_avx512vl(auVar146,auVar94);
          bVar66 = (bool)((byte)uVar68 & 1);
          auVar120._0_4_ = (uint)bVar66 * auVar88._0_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar66 * auVar88._4_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar66 * auVar88._8_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar66 * auVar88._12_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar120._16_4_ = (uint)bVar66 * auVar88._16_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar120._20_4_ = (uint)bVar66 * auVar88._20_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar120._24_4_ = (uint)bVar66 * auVar88._24_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = SUB81(uVar68 >> 7,0);
          auVar120._28_4_ = (uint)bVar66 * auVar88._28_4_ | (uint)!bVar66 * 0x7f800000;
          auVar201._8_4_ = 0xff800000;
          auVar201._0_8_ = 0xff800000ff800000;
          auVar201._12_4_ = 0xff800000;
          auVar201._16_4_ = 0xff800000;
          auVar201._20_4_ = 0xff800000;
          auVar201._24_4_ = 0xff800000;
          auVar201._28_4_ = 0xff800000;
          auVar88 = vblendmps_avx512vl(auVar201,auVar104);
          bVar66 = (bool)((byte)uVar68 & 1);
          auVar121._0_4_ = (uint)bVar66 * auVar88._0_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar66 * auVar88._4_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar66 * auVar88._8_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar66 * auVar88._12_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar121._16_4_ = (uint)bVar66 * auVar88._16_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar121._20_4_ = (uint)bVar66 * auVar88._20_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar121._24_4_ = (uint)bVar66 * auVar88._24_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = SUB81(uVar68 >> 7,0);
          auVar121._28_4_ = (uint)bVar66 * auVar88._28_4_ | (uint)!bVar66 * -0x800000;
          auVar34._8_4_ = 0x36000000;
          auVar34._0_8_ = 0x3600000036000000;
          auVar34._12_4_ = 0x36000000;
          auVar34._16_4_ = 0x36000000;
          auVar34._20_4_ = 0x36000000;
          auVar34._24_4_ = 0x36000000;
          auVar34._28_4_ = 0x36000000;
          auVar88 = vmulps_avx512vl(local_5a0,auVar34);
          uVar17 = vcmpps_avx512vl(auVar88,local_5c0,0xe);
          uVar68 = uVar68 & uVar17;
          bVar60 = (byte)uVar68;
          if (bVar60 != 0) {
            uVar17 = vcmpps_avx512vl(auVar87,ZEXT1632(auVar73),2);
            auVar247._8_4_ = 0x7f800000;
            auVar247._0_8_ = 0x7f8000007f800000;
            auVar247._12_4_ = 0x7f800000;
            auVar247._16_4_ = 0x7f800000;
            auVar247._20_4_ = 0x7f800000;
            auVar247._24_4_ = 0x7f800000;
            auVar247._28_4_ = 0x7f800000;
            auVar261._8_4_ = 0xff800000;
            auVar261._0_8_ = 0xff800000ff800000;
            auVar261._12_4_ = 0xff800000;
            auVar261._16_4_ = 0xff800000;
            auVar261._20_4_ = 0xff800000;
            auVar261._24_4_ = 0xff800000;
            auVar261._28_4_ = 0xff800000;
            auVar87 = vblendmps_avx512vl(auVar247,auVar261);
            bVar63 = (byte)uVar17;
            uVar69 = (uint)(bVar63 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar88._0_4_;
            bVar66 = (bool)((byte)(uVar17 >> 1) & 1);
            uVar127 = (uint)bVar66 * auVar87._4_4_ | (uint)!bVar66 * auVar88._4_4_;
            bVar66 = (bool)((byte)(uVar17 >> 2) & 1);
            uVar128 = (uint)bVar66 * auVar87._8_4_ | (uint)!bVar66 * auVar88._8_4_;
            bVar66 = (bool)((byte)(uVar17 >> 3) & 1);
            uVar129 = (uint)bVar66 * auVar87._12_4_ | (uint)!bVar66 * auVar88._12_4_;
            bVar66 = (bool)((byte)(uVar17 >> 4) & 1);
            uVar130 = (uint)bVar66 * auVar87._16_4_ | (uint)!bVar66 * auVar88._16_4_;
            bVar66 = (bool)((byte)(uVar17 >> 5) & 1);
            uVar131 = (uint)bVar66 * auVar87._20_4_ | (uint)!bVar66 * auVar88._20_4_;
            bVar66 = (bool)((byte)(uVar17 >> 6) & 1);
            uVar132 = (uint)bVar66 * auVar87._24_4_ | (uint)!bVar66 * auVar88._24_4_;
            bVar66 = SUB81(uVar17 >> 7,0);
            uVar133 = (uint)bVar66 * auVar87._28_4_ | (uint)!bVar66 * auVar88._28_4_;
            auVar120._0_4_ = (bVar60 & 1) * uVar69 | !(bool)(bVar60 & 1) * auVar120._0_4_;
            bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar120._4_4_ = bVar66 * uVar127 | !bVar66 * auVar120._4_4_;
            bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar120._8_4_ = bVar66 * uVar128 | !bVar66 * auVar120._8_4_;
            bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar120._12_4_ = bVar66 * uVar129 | !bVar66 * auVar120._12_4_;
            bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar120._16_4_ = bVar66 * uVar130 | !bVar66 * auVar120._16_4_;
            bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar120._20_4_ = bVar66 * uVar131 | !bVar66 * auVar120._20_4_;
            bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar120._24_4_ = bVar66 * uVar132 | !bVar66 * auVar120._24_4_;
            bVar66 = SUB81(uVar68 >> 7,0);
            auVar120._28_4_ = bVar66 * uVar133 | !bVar66 * auVar120._28_4_;
            auVar87 = vblendmps_avx512vl(auVar261,auVar247);
            bVar66 = (bool)((byte)(uVar17 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar17 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar17 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar17 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar17 >> 6) & 1);
            bVar14 = SUB81(uVar17 >> 7,0);
            auVar121._0_4_ =
                 (uint)(bVar60 & 1) *
                 ((uint)(bVar63 & 1) * auVar87._0_4_ | !(bool)(bVar63 & 1) * uVar69) |
                 !(bool)(bVar60 & 1) * auVar121._0_4_;
            bVar8 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar121._4_4_ =
                 (uint)bVar8 * ((uint)bVar66 * auVar87._4_4_ | !bVar66 * uVar127) |
                 !bVar8 * auVar121._4_4_;
            bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar121._8_4_ =
                 (uint)bVar66 * ((uint)bVar9 * auVar87._8_4_ | !bVar9 * uVar128) |
                 !bVar66 * auVar121._8_4_;
            bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar121._12_4_ =
                 (uint)bVar66 * ((uint)bVar10 * auVar87._12_4_ | !bVar10 * uVar129) |
                 !bVar66 * auVar121._12_4_;
            bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar121._16_4_ =
                 (uint)bVar66 * ((uint)bVar11 * auVar87._16_4_ | !bVar11 * uVar130) |
                 !bVar66 * auVar121._16_4_;
            bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar121._20_4_ =
                 (uint)bVar66 * ((uint)bVar12 * auVar87._20_4_ | !bVar12 * uVar131) |
                 !bVar66 * auVar121._20_4_;
            bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar121._24_4_ =
                 (uint)bVar66 * ((uint)bVar13 * auVar87._24_4_ | !bVar13 * uVar132) |
                 !bVar66 * auVar121._24_4_;
            bVar66 = SUB81(uVar68 >> 7,0);
            auVar121._28_4_ =
                 (uint)bVar66 * ((uint)bVar14 * auVar87._28_4_ | !bVar14 * uVar133) |
                 !bVar66 * auVar121._28_4_;
            uVar67 = (ulong)(byte)((~bVar60 | bVar63) & (byte)uVar67);
          }
        }
        auVar275 = ZEXT3264(local_8c0);
        auVar267 = ZEXT3264(local_8e0);
        auVar268 = ZEXT3264(local_900);
        auVar269 = ZEXT3264(local_920);
        auVar271 = ZEXT3264(local_940);
        auVar273 = ZEXT3264(local_960);
        auVar274 = ZEXT3264(local_980);
        auVar262 = ZEXT3264(local_440);
        auVar248._0_4_ = local_440._0_4_ * auVar178._0_4_;
        auVar248._4_4_ = local_440._4_4_ * auVar178._4_4_;
        auVar248._8_4_ = local_440._8_4_ * auVar178._8_4_;
        auVar248._12_4_ = local_440._12_4_ * auVar178._12_4_;
        auVar248._16_4_ = local_440._16_4_ * auVar178._16_4_;
        auVar248._20_4_ = local_440._20_4_ * auVar178._20_4_;
        auVar248._28_36_ = auVar178._28_36_;
        auVar248._24_4_ = local_440._24_4_ * auVar178._24_4_;
        auVar251 = ZEXT3264(local_420);
        auVar74 = vfmadd231ps_fma(auVar248._0_32_,local_420,auVar85);
        auVar248 = ZEXT3264(_local_400);
        auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),_local_400,auVar102);
        auVar244._8_4_ = 0x7fffffff;
        auVar244._0_8_ = 0x7fffffff7fffffff;
        auVar244._12_4_ = 0x7fffffff;
        auVar244._16_4_ = 0x7fffffff;
        auVar244._20_4_ = 0x7fffffff;
        auVar244._24_4_ = 0x7fffffff;
        auVar244._28_4_ = 0x7fffffff;
        auVar87 = vandps_avx(ZEXT1632(auVar74),auVar244);
        auVar257 = ZEXT3264(_local_720);
        _local_1c0 = _local_720;
        auVar237._8_4_ = 0x3e99999a;
        auVar237._0_8_ = 0x3e99999a3e99999a;
        auVar237._12_4_ = 0x3e99999a;
        auVar237._16_4_ = 0x3e99999a;
        auVar237._20_4_ = 0x3e99999a;
        auVar237._24_4_ = 0x3e99999a;
        auVar237._28_4_ = 0x3e99999a;
        uVar15 = vcmpps_avx512vl(auVar87,auVar237,1);
        local_3e0._0_2_ = (short)uVar15;
        auVar87 = vmaxps_avx(_local_720,auVar121);
        local_360 = auVar87;
        auVar85 = vminps_avx(local_340,auVar120);
        uVar15 = vcmpps_avx512vl(_local_720,auVar85,2);
        bVar60 = (byte)uVar15 & bVar56;
        uVar16 = vcmpps_avx512vl(auVar87,local_340,2);
        auVar270 = ZEXT3264(local_800);
        auVar272 = ZEXT3264(local_820);
        if ((bVar56 & ((byte)uVar16 | (byte)uVar15)) != 0) {
          uVar68 = CONCAT71((int7)(uVar67 >> 8),~(byte)uVar67);
          auVar49._4_4_ = local_440._4_4_ * auVar255._4_4_;
          auVar49._0_4_ = local_440._0_4_ * auVar255._0_4_;
          auVar49._8_4_ = local_440._8_4_ * auVar255._8_4_;
          auVar49._12_4_ = local_440._12_4_ * auVar255._12_4_;
          auVar49._16_4_ = local_440._16_4_ * auVar255._16_4_;
          auVar49._20_4_ = local_440._20_4_ * auVar255._20_4_;
          auVar49._24_4_ = local_440._24_4_ * auVar255._24_4_;
          auVar49._28_4_ = auVar85._28_4_;
          auVar74 = vfmadd213ps_fma(auVar103,local_420,auVar49);
          auVar74 = vfmadd213ps_fma(auVar84,_local_400,ZEXT1632(auVar74));
          auVar84 = vandps_avx(ZEXT1632(auVar74),auVar244);
          uVar15 = vcmpps_avx512vl(auVar84,auVar237,1);
          bVar63 = (byte)uVar15 | ~(byte)uVar67;
          auVar147._8_4_ = 2;
          auVar147._0_8_ = 0x200000002;
          auVar147._12_4_ = 2;
          auVar147._16_4_ = 2;
          auVar147._20_4_ = 2;
          auVar147._24_4_ = 2;
          auVar147._28_4_ = 2;
          auVar35._8_4_ = 3;
          auVar35._0_8_ = 0x300000003;
          auVar35._12_4_ = 3;
          auVar35._16_4_ = 3;
          auVar35._20_4_ = 3;
          auVar35._24_4_ = 3;
          auVar35._28_4_ = 3;
          auVar84 = vpblendmd_avx512vl(auVar147,auVar35);
          local_300._0_4_ = (uint)(bVar63 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
          bVar66 = (bool)(bVar63 >> 1 & 1);
          local_300._4_4_ = (uint)bVar66 * auVar84._4_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 2 & 1);
          local_300._8_4_ = (uint)bVar66 * auVar84._8_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 3 & 1);
          local_300._12_4_ = (uint)bVar66 * auVar84._12_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 4 & 1);
          local_300._16_4_ = (uint)bVar66 * auVar84._16_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 5 & 1);
          local_300._20_4_ = (uint)bVar66 * auVar84._20_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 6 & 1);
          local_300._24_4_ = (uint)bVar66 * auVar84._24_4_ | (uint)!bVar66 * 2;
          local_300._28_4_ = (uint)(bVar63 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar15 = vpcmpd_avx512vl(local_380,local_300,5);
          bVar63 = (byte)uVar15 & bVar60;
          if (bVar63 == 0) {
            auVar149._4_4_ = uVar61;
            auVar149._0_4_ = uVar61;
            auVar149._8_4_ = uVar61;
            auVar149._12_4_ = uVar61;
            auVar149._16_4_ = uVar61;
            auVar149._20_4_ = uVar61;
            auVar149._24_4_ = uVar61;
            auVar149._28_4_ = uVar61;
          }
          else {
            local_320 = auVar87;
            local_9b0 = (uint)uVar68;
            auVar73 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar74 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar76 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar81 = vminps_avx(auVar73,auVar76);
            auVar73 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar76 = vmaxps_avx(auVar74,auVar73);
            auVar183._8_4_ = 0x7fffffff;
            auVar183._0_8_ = 0x7fffffff7fffffff;
            auVar183._12_4_ = 0x7fffffff;
            auVar74 = vandps_avx(auVar81,auVar183);
            auVar73 = vandps_avx(auVar76,auVar183);
            auVar74 = vmaxps_avx(auVar74,auVar73);
            auVar73 = vmovshdup_avx(auVar74);
            auVar73 = vmaxss_avx(auVar73,auVar74);
            auVar74 = vshufpd_avx(auVar74,auVar74,1);
            auVar74 = vmaxss_avx(auVar74,auVar73);
            local_770._0_4_ = auVar74._0_4_ * 1.9073486e-06;
            local_610 = vshufps_avx(auVar76,auVar76,0xff);
            local_3c0 = (float)local_720._0_4_ + (float)local_9a0._0_4_;
            fStack_3bc = (float)local_720._4_4_ + (float)local_9a0._4_4_;
            fStack_3b8 = fStack_718 + fStack_998;
            fStack_3b4 = fStack_714 + fStack_994;
            fStack_3b0 = fStack_710 + fStack_990;
            fStack_3ac = fStack_70c + fStack_98c;
            fStack_3a8 = fStack_708 + fStack_988;
            fStack_3a4 = fStack_704 + fStack_984;
            do {
              auVar148._8_4_ = 0x7f800000;
              auVar148._0_8_ = 0x7f8000007f800000;
              auVar148._12_4_ = 0x7f800000;
              auVar148._16_4_ = 0x7f800000;
              auVar148._20_4_ = 0x7f800000;
              auVar148._24_4_ = 0x7f800000;
              auVar148._28_4_ = 0x7f800000;
              auVar87 = vblendmps_avx512vl(auVar148,_local_720);
              auVar122._0_4_ =
                   (uint)(bVar63 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 1 & 1);
              auVar122._4_4_ = (uint)bVar66 * auVar87._4_4_ | (uint)!bVar66 * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 2 & 1);
              auVar122._8_4_ = (uint)bVar66 * auVar87._8_4_ | (uint)!bVar66 * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 3 & 1);
              auVar122._12_4_ = (uint)bVar66 * auVar87._12_4_ | (uint)!bVar66 * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 4 & 1);
              auVar122._16_4_ = (uint)bVar66 * auVar87._16_4_ | (uint)!bVar66 * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 5 & 1);
              auVar122._20_4_ = (uint)bVar66 * auVar87._20_4_ | (uint)!bVar66 * 0x7f800000;
              auVar122._24_4_ =
                   (uint)(bVar63 >> 6) * auVar87._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
              auVar122._28_4_ = 0x7f800000;
              auVar87 = vshufps_avx(auVar122,auVar122,0xb1);
              auVar87 = vminps_avx(auVar122,auVar87);
              auVar84 = vshufpd_avx(auVar87,auVar87,5);
              auVar87 = vminps_avx(auVar87,auVar84);
              auVar84 = vpermpd_avx2(auVar87,0x4e);
              auVar87 = vminps_avx(auVar87,auVar84);
              uVar15 = vcmpps_avx512vl(auVar122,auVar87,0);
              bVar57 = (byte)uVar15 & bVar63;
              bVar58 = bVar63;
              if (bVar57 != 0) {
                bVar58 = bVar57;
              }
              iVar19 = 0;
              for (uVar61 = (uint)bVar58; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              auVar178 = ZEXT464(*(uint *)(local_1e0 + (uint)(iVar19 << 2)));
              auVar251 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
              fVar218 = local_9a8;
              if ((float)local_6c0._0_4_ < 0.0) {
                local_880._0_16_ = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar19 << 2)));
                local_7a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
                fVar218 = sqrtf((float)local_6c0._0_4_);
                auVar251 = ZEXT1664(local_7a0._0_16_);
                auVar178 = ZEXT1664(local_880._0_16_);
              }
              bVar66 = true;
              uVar67 = 0;
              do {
                local_7a0._0_16_ = auVar251._0_16_;
                uVar159 = auVar251._0_4_;
                auVar139._4_4_ = uVar159;
                auVar139._0_4_ = uVar159;
                auVar139._8_4_ = uVar159;
                auVar139._12_4_ = uVar159;
                auVar74 = vfmadd132ps_fma(auVar139,ZEXT816(0) << 0x40,local_6b0);
                fVar253 = auVar178._0_4_;
                fVar217 = 1.0 - fVar253;
                fVar252 = fVar217 * fVar217 * fVar217;
                fVar249 = fVar253 * fVar253;
                fVar216 = fVar253 * fVar249;
                auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar252),
                                          ZEXT416((uint)fVar216));
                fVar239 = fVar253 * fVar217;
                auVar222 = ZEXT416((uint)fVar217);
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * fVar239 * 6.0)),
                                          ZEXT416((uint)(fVar239 * fVar217)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar216),
                                          ZEXT416((uint)fVar252));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar217 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar253 * fVar239)));
                fVar252 = fVar252 * 0.16666667;
                fVar253 = (auVar73._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar215 = (auVar76._0_4_ + auVar82._0_4_) * 0.16666667;
                fVar216 = fVar216 * 0.16666667;
                auVar184._0_4_ = fVar216 * (float)local_6a0._0_4_;
                auVar184._4_4_ = fVar216 * (float)local_6a0._4_4_;
                auVar184._8_4_ = fVar216 * fStack_698;
                auVar184._12_4_ = fVar216 * fStack_694;
                auVar223._4_4_ = fVar215;
                auVar223._0_4_ = fVar215;
                auVar223._8_4_ = fVar215;
                auVar223._12_4_ = fVar215;
                auVar73 = vfmadd132ps_fma(auVar223,auVar184,local_660._0_16_);
                auVar185._4_4_ = fVar253;
                auVar185._0_4_ = fVar253;
                auVar185._8_4_ = fVar253;
                auVar185._12_4_ = fVar253;
                auVar73 = vfmadd132ps_fma(auVar185,auVar73,local_680._0_16_);
                auVar163._4_4_ = fVar252;
                auVar163._0_4_ = fVar252;
                auVar163._8_4_ = fVar252;
                auVar163._12_4_ = fVar252;
                auVar73 = vfmadd132ps_fma(auVar163,auVar73,local_640._0_16_);
                local_540._0_16_ = auVar73;
                auVar74 = vsubps_avx(auVar74,auVar73);
                local_6e0._0_16_ = auVar74;
                auVar74 = vdpps_avx(auVar74,auVar74,0x7f);
                local_880._0_16_ = auVar178._0_16_;
                local_700._0_16_ = auVar74;
                if (auVar74._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar249;
                  local_7e0._0_4_ = fVar239;
                  auVar251._0_4_ = sqrtf(auVar74._0_4_);
                  auVar251._4_60_ = extraout_var;
                  auVar74 = auVar251._0_16_;
                  fVar239 = (float)local_7e0._0_4_;
                  auVar73 = local_880._0_16_;
                }
                else {
                  auVar74 = vsqrtss_avx(auVar74,auVar74);
                  local_7c0._0_4_ = fVar249;
                  auVar73 = auVar178._0_16_;
                }
                local_560._4_4_ = fVar217;
                local_560._0_4_ = fVar217;
                fStack_558 = fVar217;
                fStack_554 = fVar217;
                auVar76 = vfnmsub213ss_fma(auVar73,auVar73,ZEXT416((uint)(fVar239 * 4.0)));
                auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * 4.0)),auVar222,auVar222);
                fVar249 = fVar217 * -fVar217 * 0.5;
                fVar239 = auVar76._0_4_ * 0.5;
                fVar252 = auVar73._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar211._0_4_ = (float)local_7c0._0_4_ * (float)local_6a0._0_4_;
                auVar211._4_4_ = (float)local_7c0._0_4_ * (float)local_6a0._4_4_;
                auVar211._8_4_ = (float)local_7c0._0_4_ * fStack_698;
                auVar211._12_4_ = (float)local_7c0._0_4_ * fStack_694;
                auVar164._4_4_ = fVar252;
                auVar164._0_4_ = fVar252;
                auVar164._8_4_ = fVar252;
                auVar164._12_4_ = fVar252;
                auVar73 = vfmadd132ps_fma(auVar164,auVar211,local_660._0_16_);
                auVar186._4_4_ = fVar239;
                auVar186._0_4_ = fVar239;
                auVar186._8_4_ = fVar239;
                auVar186._12_4_ = fVar239;
                auVar73 = vfmadd132ps_fma(auVar186,auVar73,local_680._0_16_);
                auVar259._4_4_ = fVar249;
                auVar259._0_4_ = fVar249;
                auVar259._8_4_ = fVar249;
                auVar259._12_4_ = fVar249;
                _local_7c0 = vfmadd132ps_fma(auVar259,auVar73,local_640._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar51._12_4_ = 0;
                auVar51._0_12_ = ZEXT812(0);
                fVar249 = local_580._0_4_;
                auVar73 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar249));
                fVar239 = auVar73._0_4_;
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar249));
                auVar73 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_5c0._0_4_ = auVar73._0_4_;
                local_7e0._0_4_ = auVar74._0_4_;
                if (fVar249 < -fVar249) {
                  auVar254._0_4_ = sqrtf(fVar249);
                  auVar254._4_60_ = extraout_var_00;
                  auVar74 = ZEXT416((uint)local_7e0._0_4_);
                  auVar76 = auVar254._0_16_;
                  auVar73 = _local_7c0;
                }
                else {
                  auVar76 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar73 = _local_7c0;
                }
                fVar249 = fVar239 * 1.5 + fVar249 * -0.5 * fVar239 * fVar239 * fVar239;
                auVar140._0_4_ = auVar73._0_4_ * fVar249;
                auVar140._4_4_ = auVar73._4_4_ * fVar249;
                auVar140._8_4_ = auVar73._8_4_ * fVar249;
                auVar140._12_4_ = auVar73._12_4_ * fVar249;
                auVar81 = vdpps_avx(local_6e0._0_16_,auVar140,0x7f);
                fVar253 = auVar74._0_4_;
                fVar239 = auVar81._0_4_;
                auVar141._0_4_ = fVar239 * fVar239;
                auVar141._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar141._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar141._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar82 = vsubps_avx(local_700._0_16_,auVar141);
                fVar252 = auVar82._0_4_;
                auVar165._4_12_ = ZEXT812(0) << 0x20;
                auVar165._0_4_ = fVar252;
                auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
                auVar75 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
                auVar78 = vmulss_avx512f(auVar82,ZEXT416(0xbf000000));
                if (fVar252 < 0.0) {
                  local_5e0._0_4_ = auVar75._0_4_;
                  local_600 = fVar249;
                  fStack_5fc = fVar249;
                  fStack_5f8 = fVar249;
                  fStack_5f4 = fVar249;
                  local_5f0 = auVar77;
                  fVar228 = sqrtf(fVar252);
                  auVar78 = ZEXT416(auVar78._0_4_);
                  auVar75 = ZEXT416((uint)local_5e0._0_4_);
                  auVar76 = ZEXT416(auVar76._0_4_);
                  auVar74 = ZEXT416((uint)local_7e0._0_4_);
                  auVar73 = _local_7c0;
                  auVar77 = local_5f0;
                  fVar249 = local_600;
                  fVar252 = fStack_5fc;
                  fVar215 = fStack_5f8;
                  fVar216 = fStack_5f4;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                  fVar228 = auVar82._0_4_;
                  fVar252 = fVar249;
                  fVar215 = fVar249;
                  fVar216 = fVar249;
                }
                auVar262 = ZEXT1664(auVar73);
                auVar257 = ZEXT1664(local_700._0_16_);
                auVar254 = ZEXT1664(local_6e0._0_16_);
                auVar275 = ZEXT3264(local_8c0);
                auVar267 = ZEXT3264(local_8e0);
                auVar268 = ZEXT3264(local_900);
                auVar269 = ZEXT3264(local_920);
                auVar270 = ZEXT3264(local_800);
                auVar271 = ZEXT3264(local_940);
                auVar272 = ZEXT3264(local_820);
                auVar273 = ZEXT3264(local_960);
                auVar274 = ZEXT3264(local_980);
                auVar276 = ZEXT3264(local_840);
                auVar277 = ZEXT3264(local_860);
                auVar278 = ZEXT3264(local_8a0);
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar222,local_880._0_16_);
                auVar82 = vfmadd231ss_fma(auVar222,local_880._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar229 = local_880._0_4_;
                auVar187._0_4_ = fVar229 * (float)local_6a0._0_4_;
                auVar187._4_4_ = fVar229 * (float)local_6a0._4_4_;
                auVar187._8_4_ = fVar229 * fStack_698;
                auVar187._12_4_ = fVar229 * fStack_694;
                auVar212._0_4_ = auVar82._0_4_;
                auVar212._4_4_ = auVar212._0_4_;
                auVar212._8_4_ = auVar212._0_4_;
                auVar212._12_4_ = auVar212._0_4_;
                auVar82 = vfmadd132ps_fma(auVar212,auVar187,local_660._0_16_);
                auVar166._0_4_ = auVar80._0_4_;
                auVar166._4_4_ = auVar166._0_4_;
                auVar166._8_4_ = auVar166._0_4_;
                auVar166._12_4_ = auVar166._0_4_;
                auVar82 = vfmadd132ps_fma(auVar166,auVar82,local_680._0_16_);
                auVar82 = vfmadd132ps_fma(_local_560,auVar82,local_640._0_16_);
                auVar167._0_4_ = auVar82._0_4_ * (float)local_580._0_4_;
                auVar167._4_4_ = auVar82._4_4_ * (float)local_580._0_4_;
                auVar167._8_4_ = auVar82._8_4_ * (float)local_580._0_4_;
                auVar167._12_4_ = auVar82._12_4_ * (float)local_580._0_4_;
                auVar82 = vdpps_avx(auVar73,auVar82,0x7f);
                fVar217 = auVar82._0_4_;
                auVar188._0_4_ = auVar73._0_4_ * fVar217;
                auVar188._4_4_ = auVar73._4_4_ * fVar217;
                auVar188._8_4_ = auVar73._8_4_ * fVar217;
                auVar188._12_4_ = auVar73._12_4_ * fVar217;
                auVar82 = vsubps_avx(auVar167,auVar188);
                fVar217 = (float)local_5c0._0_4_ * (float)local_5a0._0_4_;
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar79 = vxorps_avx512vl(auVar73,auVar26);
                auVar224._0_4_ = fVar249 * auVar82._0_4_ * fVar217;
                auVar224._4_4_ = fVar252 * auVar82._4_4_ * fVar217;
                auVar224._8_4_ = fVar215 * auVar82._8_4_ * fVar217;
                auVar224._12_4_ = fVar216 * auVar82._12_4_ * fVar217;
                auVar82 = vdpps_avx(auVar79,auVar140,0x7f);
                auVar222 = vmaxss_avx(ZEXT416((uint)local_770._0_4_),
                                      ZEXT416((uint)((float)local_7a0._0_4_ *
                                                    fVar218 * 1.9073486e-06)));
                auVar80 = vdivss_avx512f(ZEXT416((uint)local_770._0_4_),auVar76);
                auVar76 = vdpps_avx(local_6e0._0_16_,auVar224,0x7f);
                auVar74 = vfmadd213ss_fma(auVar74,ZEXT416((uint)local_770._0_4_),auVar222);
                auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar253 + 1.0)),auVar80,auVar74);
                auVar74 = vdpps_avx(local_6b0,auVar140,0x7f);
                fVar249 = auVar82._0_4_ + auVar76._0_4_;
                auVar76 = vdpps_avx(local_6e0._0_16_,auVar79,0x7f);
                auVar78 = vmulss_avx512f(auVar78,auVar77);
                auVar77 = vmulss_avx512f(auVar77,auVar77);
                auVar82 = vdpps_avx(local_6e0._0_16_,local_6b0,0x7f);
                auVar78 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar78._0_4_ * auVar77._0_4_)));
                auVar77 = vfnmadd231ss_fma(auVar76,auVar81,ZEXT416((uint)fVar249));
                auVar75 = vfnmadd231ss_fma(auVar82,auVar81,auVar74);
                auVar76 = vpermilps_avx(local_540._0_16_,0xff);
                fVar228 = fVar228 - auVar76._0_4_;
                auVar76 = vshufps_avx(auVar73,auVar73,0xff);
                auVar82 = vfmsub213ss_fma(auVar77,auVar78,auVar76);
                fVar252 = auVar75._0_4_ * auVar78._0_4_;
                auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar82._0_4_)),
                                          ZEXT416((uint)fVar249),ZEXT416((uint)fVar252));
                auVar248 = ZEXT1664(auVar77);
                fVar253 = auVar77._0_4_;
                fVar229 = fVar229 - (fVar239 * (fVar252 / fVar253) -
                                    fVar228 * (auVar74._0_4_ / fVar253));
                auVar178 = ZEXT464((uint)fVar229);
                fVar230 = (float)local_7a0._0_4_ -
                          (fVar228 * (fVar249 / fVar253) - fVar239 * (auVar82._0_4_ / fVar253));
                auVar251 = ZEXT464((uint)fVar230);
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar74 = vandps_avx512vl(auVar81,auVar27);
                fVar249 = (float)local_9a0._0_4_;
                fVar252 = (float)local_9a0._4_4_;
                fVar253 = fStack_998;
                fVar215 = fStack_994;
                fVar216 = fStack_990;
                fVar217 = fStack_98c;
                fVar238 = fStack_988;
                fVar239 = fStack_984;
                if (auVar74._0_4_ < auVar80._0_4_) {
                  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar222._0_4_)),
                                            local_610,ZEXT416(0x36000000));
                  auVar28._8_4_ = 0x7fffffff;
                  auVar28._0_8_ = 0x7fffffff7fffffff;
                  auVar28._12_4_ = 0x7fffffff;
                  auVar81 = vandps_avx512vl(ZEXT416((uint)fVar228),auVar28);
                  if (auVar81._0_4_ < auVar74._0_4_) {
                    fVar218 = fVar230 + (float)local_620._0_4_;
                    if (fVar152 <= fVar218) {
                      fVar228 = *(float *)(ray + k * 4 + 0x80);
                      bVar58 = 0;
                      if (((fVar228 < fVar218) || (fVar229 < 0.0)) || (bVar58 = 0, 1.0 < fVar229))
                      goto LAB_01ba2cd2;
                      auVar189._4_12_ = SUB1612(ZEXT816(0),0);
                      auVar189._0_4_ = local_700._0_4_;
                      auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar189);
                      fVar231 = auVar74._0_4_;
                      pGVar3 = (context->scene->geometries).items[local_758].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar58 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01ba2cd2;
                        fVar231 = fVar231 * 1.5 +
                                  local_700._0_4_ * -0.5 * fVar231 * fVar231 * fVar231;
                        auVar190._0_4_ = local_6e0._0_4_ * fVar231;
                        auVar190._4_4_ = local_6e0._4_4_ * fVar231;
                        auVar190._8_4_ = local_6e0._8_4_ * fVar231;
                        auVar190._12_4_ = local_6e0._12_4_ * fVar231;
                        auVar82 = vfmadd213ps_fma(auVar76,auVar190,auVar73);
                        auVar74 = vshufps_avx(auVar190,auVar190,0xc9);
                        auVar76 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar191._0_4_ = auVar190._0_4_ * auVar76._0_4_;
                        auVar191._4_4_ = auVar190._4_4_ * auVar76._4_4_;
                        auVar191._8_4_ = auVar190._8_4_ * auVar76._8_4_;
                        auVar191._12_4_ = auVar190._12_4_ * auVar76._12_4_;
                        auVar81 = vfmsub231ps_fma(auVar191,auVar73,auVar74);
                        auVar74 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar76 = vshufps_avx(auVar82,auVar82,0xc9);
                        auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                        auVar142._0_4_ = auVar82._0_4_ * auVar81._0_4_;
                        auVar142._4_4_ = auVar82._4_4_ * auVar81._4_4_;
                        auVar142._8_4_ = auVar82._8_4_ * auVar81._8_4_;
                        auVar142._12_4_ = auVar82._12_4_ * auVar81._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar142,auVar74,auVar76);
                        local_4e0 = (RTCHitN  [16])vshufps_avx(auVar74,auVar74,0x55);
                        auStack_4d0 = vshufps_avx(auVar74,auVar74,0xaa);
                        local_4c0 = auVar74._0_4_;
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        local_4b0 = fVar229;
                        fStack_4ac = fVar229;
                        fStack_4a8 = fVar229;
                        fStack_4a4 = fVar229;
                        local_4a0 = ZEXT416(0) << 0x20;
                        local_490 = local_4f0._0_8_;
                        uStack_488 = local_4f0._8_8_;
                        local_480 = local_500;
                        vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                        uStack_46c = context->user->instID[0];
                        local_470 = uStack_46c;
                        uStack_468 = uStack_46c;
                        uStack_464 = uStack_46c;
                        uStack_460 = context->user->instPrimID[0];
                        uStack_45c = uStack_460;
                        uStack_458 = uStack_460;
                        uStack_454 = uStack_460;
                        *(float *)(ray + k * 4 + 0x80) = fVar218;
                        local_9c0 = local_510;
                        local_750.valid = (int *)local_9c0;
                        local_750.geometryUserPtr = pGVar3->userPtr;
                        local_750.context = context->user;
                        local_750.hit = local_4e0;
                        local_750.N = 4;
                        local_750.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar248 = ZEXT1664(auVar77);
                          auVar251 = ZEXT464((uint)fVar230);
                          auVar254 = ZEXT1664(local_6e0._0_16_);
                          auVar257 = ZEXT1664(local_700._0_16_);
                          auVar262 = ZEXT1664(auVar73);
                          (*pGVar3->occlusionFilterN)(&local_750);
                          auVar278 = ZEXT3264(local_8a0);
                          auVar277 = ZEXT3264(local_860);
                          auVar276 = ZEXT3264(local_840);
                          auVar274 = ZEXT3264(local_980);
                          auVar273 = ZEXT3264(local_960);
                          auVar272 = ZEXT3264(local_820);
                          auVar271 = ZEXT3264(local_940);
                          auVar270 = ZEXT3264(local_800);
                          auVar269 = ZEXT3264(local_920);
                          auVar268 = ZEXT3264(local_900);
                          auVar267 = ZEXT3264(local_8e0);
                          auVar275 = ZEXT3264(local_8c0);
                          fVar249 = (float)local_9a0._0_4_;
                          fVar252 = (float)local_9a0._4_4_;
                          fVar253 = fStack_998;
                          fVar215 = fStack_994;
                          fVar216 = fStack_990;
                          fVar217 = fStack_98c;
                          fVar238 = fStack_988;
                          fVar239 = fStack_984;
                        }
                        uVar67 = vptestmd_avx512vl(local_9c0,local_9c0);
                        if ((uVar67 & 0xf) != 0) {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar248 = ZEXT1664(auVar248._0_16_);
                            auVar251 = ZEXT1664(auVar251._0_16_);
                            auVar254 = ZEXT1664(auVar254._0_16_);
                            auVar257 = ZEXT1664(auVar257._0_16_);
                            auVar262 = ZEXT1664(auVar262._0_16_);
                            (*p_Var7)(&local_750);
                            auVar278 = ZEXT3264(local_8a0);
                            auVar277 = ZEXT3264(local_860);
                            auVar276 = ZEXT3264(local_840);
                            auVar274 = ZEXT3264(local_980);
                            auVar273 = ZEXT3264(local_960);
                            auVar272 = ZEXT3264(local_820);
                            auVar271 = ZEXT3264(local_940);
                            auVar270 = ZEXT3264(local_800);
                            auVar269 = ZEXT3264(local_920);
                            auVar268 = ZEXT3264(local_900);
                            auVar267 = ZEXT3264(local_8e0);
                            auVar275 = ZEXT3264(local_8c0);
                            fVar249 = (float)local_9a0._0_4_;
                            fVar252 = (float)local_9a0._4_4_;
                            fVar253 = fStack_998;
                            fVar215 = fStack_994;
                            fVar216 = fStack_990;
                            fVar217 = fStack_98c;
                            fVar238 = fStack_988;
                            fVar239 = fStack_984;
                          }
                          uVar67 = vptestmd_avx512vl(local_9c0,local_9c0);
                          uVar67 = uVar67 & 0xf;
                          auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar8 = (bool)((byte)uVar67 & 1);
                          bVar9 = (bool)((byte)(uVar67 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
                          bVar11 = SUB81(uVar67 >> 3,0);
                          *(uint *)(local_750.ray + 0x80) =
                               (uint)bVar8 * auVar74._0_4_ |
                               (uint)!bVar8 * *(int *)(local_750.ray + 0x80);
                          *(uint *)(local_750.ray + 0x84) =
                               (uint)bVar9 * auVar74._4_4_ |
                               (uint)!bVar9 * *(int *)(local_750.ray + 0x84);
                          *(uint *)(local_750.ray + 0x88) =
                               (uint)bVar10 * auVar74._8_4_ |
                               (uint)!bVar10 * *(int *)(local_750.ray + 0x88);
                          *(uint *)(local_750.ray + 0x8c) =
                               (uint)bVar11 * auVar74._12_4_ |
                               (uint)!bVar11 * *(int *)(local_750.ray + 0x8c);
                          bVar58 = 1;
                          if ((byte)uVar67 != 0) goto LAB_01ba2cd2;
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar228;
                        bVar58 = 0;
                        goto LAB_01ba2cd2;
                      }
                    }
                    bVar58 = 0;
                    goto LAB_01ba2cd2;
                  }
                }
                bVar66 = uVar67 < 4;
                uVar67 = uVar67 + 1;
              } while (uVar67 != 5);
              bVar66 = false;
              bVar58 = 5;
LAB_01ba2cd2:
              bVar64 = (bool)(bVar64 | bVar66 & bVar58);
              uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar149._4_4_ = uVar159;
              auVar149._0_4_ = uVar159;
              auVar149._8_4_ = uVar159;
              auVar149._12_4_ = uVar159;
              auVar149._16_4_ = uVar159;
              auVar149._20_4_ = uVar159;
              auVar149._24_4_ = uVar159;
              auVar149._28_4_ = uVar159;
              auVar53._4_4_ = fStack_3bc;
              auVar53._0_4_ = local_3c0;
              auVar53._8_4_ = fStack_3b8;
              auVar53._12_4_ = fStack_3b4;
              auVar53._16_4_ = fStack_3b0;
              auVar53._20_4_ = fStack_3ac;
              auVar53._24_4_ = fStack_3a8;
              auVar53._28_4_ = fStack_3a4;
              uVar15 = vcmpps_avx512vl(auVar149,auVar53,0xd);
              bVar63 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar63 & (byte)uVar15;
            } while (bVar63 != 0);
            uVar68 = (ulong)local_9b0;
            auVar87 = local_320;
          }
          auVar178 = ZEXT3264(local_360);
          bVar63 = local_3e0[0] | (byte)uVar68;
          auVar174._0_4_ = fVar249 + auVar87._0_4_;
          auVar174._4_4_ = fVar252 + auVar87._4_4_;
          auVar174._8_4_ = fVar253 + auVar87._8_4_;
          auVar174._12_4_ = fVar215 + auVar87._12_4_;
          auVar174._16_4_ = fVar216 + auVar87._16_4_;
          auVar174._20_4_ = fVar217 + auVar87._20_4_;
          auVar174._24_4_ = fVar238 + auVar87._24_4_;
          auVar174._28_4_ = fVar239 + auVar87._28_4_;
          uVar15 = vcmpps_avx512vl(auVar174,auVar149,2);
          bVar56 = (byte)uVar16 & bVar56 & (byte)uVar15;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar36._8_4_ = 3;
          auVar36._0_8_ = 0x300000003;
          auVar36._12_4_ = 3;
          auVar36._16_4_ = 3;
          auVar36._20_4_ = 3;
          auVar36._24_4_ = 3;
          auVar36._28_4_ = 3;
          auVar87 = vpblendmd_avx512vl(auVar175,auVar36);
          auVar123._0_4_ = (uint)(bVar63 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
          bVar66 = (bool)(bVar63 >> 1 & 1);
          auVar123._4_4_ = (uint)bVar66 * auVar87._4_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 2 & 1);
          auVar123._8_4_ = (uint)bVar66 * auVar87._8_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 3 & 1);
          auVar123._12_4_ = (uint)bVar66 * auVar87._12_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 4 & 1);
          auVar123._16_4_ = (uint)bVar66 * auVar87._16_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 5 & 1);
          auVar123._20_4_ = (uint)bVar66 * auVar87._20_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 6 & 1);
          auVar123._24_4_ = (uint)bVar66 * auVar87._24_4_ | (uint)!bVar66 * 2;
          auVar123._28_4_ = (uint)(bVar63 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
          uVar15 = vpcmpd_avx512vl(local_380,auVar123,5);
          bVar63 = (byte)uVar15 & bVar56;
          if (bVar63 != 0) {
            local_3e0 = auVar123;
            auVar73 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar74 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar76 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar81 = vminps_avx(auVar73,auVar76);
            auVar73 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar76 = vmaxps_avx(auVar74,auVar73);
            auVar192._8_4_ = 0x7fffffff;
            auVar192._0_8_ = 0x7fffffff7fffffff;
            auVar192._12_4_ = 0x7fffffff;
            auVar74 = vandps_avx(auVar81,auVar192);
            auVar73 = vandps_avx(auVar76,auVar192);
            auVar74 = vmaxps_avx(auVar74,auVar73);
            auVar73 = vmovshdup_avx(auVar74);
            auVar73 = vmaxss_avx(auVar73,auVar74);
            auVar74 = vshufpd_avx(auVar74,auVar74,1);
            auVar74 = vmaxss_avx(auVar74,auVar73);
            fVar218 = auVar74._0_4_ * 1.9073486e-06;
            local_610 = vshufps_avx(auVar76,auVar76,0xff);
            local_3c0 = fVar249 + local_360._0_4_;
            fStack_3bc = fVar252 + local_360._4_4_;
            fStack_3b8 = fVar253 + local_360._8_4_;
            fStack_3b4 = fVar215 + local_360._12_4_;
            fStack_3b0 = fVar216 + local_360._16_4_;
            fStack_3ac = fVar217 + local_360._20_4_;
            fStack_3a8 = fVar238 + local_360._24_4_;
            fStack_3a4 = fVar239 + local_360._28_4_;
            _local_720 = local_360;
            do {
              auVar150._8_4_ = 0x7f800000;
              auVar150._0_8_ = 0x7f8000007f800000;
              auVar150._12_4_ = 0x7f800000;
              auVar150._16_4_ = 0x7f800000;
              auVar150._20_4_ = 0x7f800000;
              auVar150._24_4_ = 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar87 = vblendmps_avx512vl(auVar150,auVar178._0_32_);
              auVar124._0_4_ =
                   (uint)(bVar63 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 1 & 1);
              auVar124._4_4_ = (uint)bVar66 * auVar87._4_4_ | (uint)!bVar66 * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 2 & 1);
              auVar124._8_4_ = (uint)bVar66 * auVar87._8_4_ | (uint)!bVar66 * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 3 & 1);
              auVar124._12_4_ = (uint)bVar66 * auVar87._12_4_ | (uint)!bVar66 * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 4 & 1);
              auVar124._16_4_ = (uint)bVar66 * auVar87._16_4_ | (uint)!bVar66 * 0x7f800000;
              bVar66 = (bool)(bVar63 >> 5 & 1);
              auVar124._20_4_ = (uint)bVar66 * auVar87._20_4_ | (uint)!bVar66 * 0x7f800000;
              auVar124._24_4_ =
                   (uint)(bVar63 >> 6) * auVar87._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
              auVar124._28_4_ = 0x7f800000;
              auVar87 = vshufps_avx(auVar124,auVar124,0xb1);
              auVar87 = vminps_avx(auVar124,auVar87);
              auVar84 = vshufpd_avx(auVar87,auVar87,5);
              auVar87 = vminps_avx(auVar87,auVar84);
              auVar84 = vpermpd_avx2(auVar87,0x4e);
              auVar87 = vminps_avx(auVar87,auVar84);
              uVar15 = vcmpps_avx512vl(auVar124,auVar87,0);
              bVar57 = (byte)uVar15 & bVar63;
              bVar58 = bVar63;
              if (bVar57 != 0) {
                bVar58 = bVar57;
              }
              iVar19 = 0;
              for (uVar61 = (uint)bVar58; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              auVar178 = ZEXT464(*(uint *)(local_200 + (uint)(iVar19 << 2)));
              auVar251 = ZEXT464(*(uint *)(local_340 + (uint)(iVar19 << 2)));
              fVar228 = local_9a4;
              if ((float)local_6c0._0_4_ < 0.0) {
                local_880._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar19 << 2)));
                local_7a0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar19 << 2)));
                fVar228 = sqrtf((float)local_6c0._0_4_);
                auVar251 = ZEXT1664(local_7a0._0_16_);
                auVar178 = ZEXT1664(local_880._0_16_);
              }
              bVar66 = true;
              uVar67 = 0;
              do {
                local_7a0._0_16_ = auVar251._0_16_;
                uVar159 = auVar251._0_4_;
                auVar143._4_4_ = uVar159;
                auVar143._0_4_ = uVar159;
                auVar143._8_4_ = uVar159;
                auVar143._12_4_ = uVar159;
                auVar74 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_6b0);
                fVar253 = auVar178._0_4_;
                fVar217 = 1.0 - fVar253;
                fVar252 = fVar217 * fVar217 * fVar217;
                fVar249 = fVar253 * fVar253;
                fVar216 = fVar253 * fVar249;
                auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar252),
                                          ZEXT416((uint)fVar216));
                fVar239 = fVar253 * fVar217;
                auVar222 = ZEXT416((uint)fVar217);
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * fVar239 * 6.0)),
                                          ZEXT416((uint)(fVar239 * fVar217)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar216),
                                          ZEXT416((uint)fVar252));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar217 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar253 * fVar239)));
                fVar252 = fVar252 * 0.16666667;
                fVar253 = (auVar73._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar215 = (auVar76._0_4_ + auVar82._0_4_) * 0.16666667;
                fVar216 = fVar216 * 0.16666667;
                auVar193._0_4_ = fVar216 * (float)local_6a0._0_4_;
                auVar193._4_4_ = fVar216 * (float)local_6a0._4_4_;
                auVar193._8_4_ = fVar216 * fStack_698;
                auVar193._12_4_ = fVar216 * fStack_694;
                auVar225._4_4_ = fVar215;
                auVar225._0_4_ = fVar215;
                auVar225._8_4_ = fVar215;
                auVar225._12_4_ = fVar215;
                auVar73 = vfmadd132ps_fma(auVar225,auVar193,local_660._0_16_);
                auVar194._4_4_ = fVar253;
                auVar194._0_4_ = fVar253;
                auVar194._8_4_ = fVar253;
                auVar194._12_4_ = fVar253;
                auVar73 = vfmadd132ps_fma(auVar194,auVar73,local_680._0_16_);
                auVar168._4_4_ = fVar252;
                auVar168._0_4_ = fVar252;
                auVar168._8_4_ = fVar252;
                auVar168._12_4_ = fVar252;
                auVar73 = vfmadd132ps_fma(auVar168,auVar73,local_640._0_16_);
                local_540._0_16_ = auVar73;
                auVar74 = vsubps_avx(auVar74,auVar73);
                local_6e0._0_16_ = auVar74;
                auVar74 = vdpps_avx(auVar74,auVar74,0x7f);
                local_880._0_16_ = auVar178._0_16_;
                local_700._0_16_ = auVar74;
                if (auVar74._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar249;
                  local_7e0._0_4_ = fVar239;
                  auVar257._0_4_ = sqrtf(auVar74._0_4_);
                  auVar257._4_60_ = extraout_var_01;
                  auVar74 = auVar257._0_16_;
                  fVar239 = (float)local_7e0._0_4_;
                  auVar73 = local_880._0_16_;
                }
                else {
                  auVar74 = vsqrtss_avx(auVar74,auVar74);
                  local_7c0._0_4_ = fVar249;
                  auVar73 = auVar178._0_16_;
                }
                local_560._4_4_ = fVar217;
                local_560._0_4_ = fVar217;
                fStack_558 = fVar217;
                fStack_554 = fVar217;
                auVar76 = vfnmsub213ss_fma(auVar73,auVar73,ZEXT416((uint)(fVar239 * 4.0)));
                auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * 4.0)),auVar222,auVar222);
                fVar249 = fVar217 * -fVar217 * 0.5;
                fVar239 = auVar76._0_4_ * 0.5;
                fVar252 = auVar73._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar213._0_4_ = (float)local_7c0._0_4_ * (float)local_6a0._0_4_;
                auVar213._4_4_ = (float)local_7c0._0_4_ * (float)local_6a0._4_4_;
                auVar213._8_4_ = (float)local_7c0._0_4_ * fStack_698;
                auVar213._12_4_ = (float)local_7c0._0_4_ * fStack_694;
                auVar169._4_4_ = fVar252;
                auVar169._0_4_ = fVar252;
                auVar169._8_4_ = fVar252;
                auVar169._12_4_ = fVar252;
                auVar73 = vfmadd132ps_fma(auVar169,auVar213,local_660._0_16_);
                auVar195._4_4_ = fVar239;
                auVar195._0_4_ = fVar239;
                auVar195._8_4_ = fVar239;
                auVar195._12_4_ = fVar239;
                auVar73 = vfmadd132ps_fma(auVar195,auVar73,local_680._0_16_);
                auVar260._4_4_ = fVar249;
                auVar260._0_4_ = fVar249;
                auVar260._8_4_ = fVar249;
                auVar260._12_4_ = fVar249;
                _local_7c0 = vfmadd132ps_fma(auVar260,auVar73,local_640._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar52._12_4_ = 0;
                auVar52._0_12_ = ZEXT812(0);
                fVar249 = local_580._0_4_;
                auVar76 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar249));
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar249));
                auVar73 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_5c0._0_4_ = auVar73._0_4_;
                local_7e0._0_4_ = auVar74._0_4_;
                if (fVar249 < -fVar249) {
                  local_770 = auVar76;
                  auVar262._0_4_ = sqrtf(fVar249);
                  auVar262._4_60_ = extraout_var_02;
                  auVar74 = ZEXT416((uint)local_7e0._0_4_);
                  auVar82 = auVar262._0_16_;
                  auVar73 = local_770;
                  auVar81 = _local_7c0;
                }
                else {
                  auVar82 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar73 = auVar76;
                  auVar81 = _local_7c0;
                }
                fVar239 = auVar73._0_4_;
                fVar249 = auVar76._0_4_ * 1.5 + fVar249 * -0.5 * fVar239 * fVar239 * fVar239;
                auVar266._0_4_ = auVar81._0_4_ * fVar249;
                auVar266._4_4_ = auVar81._4_4_ * fVar249;
                auVar266._8_4_ = auVar81._8_4_ * fVar249;
                auVar266._12_4_ = auVar81._12_4_ * fVar249;
                auVar73 = vdpps_avx(local_6e0._0_16_,auVar266,0x7f);
                fVar239 = auVar74._0_4_ + 1.0;
                fVar252 = auVar73._0_4_;
                auVar144._0_4_ = fVar252 * fVar252;
                auVar144._4_4_ = auVar73._4_4_ * auVar73._4_4_;
                auVar144._8_4_ = auVar73._8_4_ * auVar73._8_4_;
                auVar144._12_4_ = auVar73._12_4_ * auVar73._12_4_;
                auVar76 = vsubps_avx(local_700._0_16_,auVar144);
                fVar253 = auVar76._0_4_;
                auVar170._4_12_ = ZEXT812(0) << 0x20;
                auVar170._0_4_ = fVar253;
                auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
                auVar75 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
                auVar78 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
                if (fVar253 < 0.0) {
                  local_770._0_4_ = fVar239;
                  local_600 = fVar249;
                  fStack_5fc = fVar249;
                  fStack_5f8 = fVar249;
                  fStack_5f4 = fVar249;
                  local_5f0 = auVar266;
                  local_5e0 = auVar77;
                  fVar229 = sqrtf(fVar253);
                  auVar78 = ZEXT416(auVar78._0_4_);
                  auVar75 = ZEXT416(auVar75._0_4_);
                  auVar82 = ZEXT416(auVar82._0_4_);
                  auVar74 = ZEXT416((uint)local_7e0._0_4_);
                  auVar81 = _local_7c0;
                  fVar239 = (float)local_770._0_4_;
                  auVar266 = local_5f0;
                  auVar77 = local_5e0;
                  fVar249 = local_600;
                  fVar253 = fStack_5fc;
                  fVar215 = fStack_5f8;
                  fVar216 = fStack_5f4;
                }
                else {
                  auVar76 = vsqrtss_avx(auVar76,auVar76);
                  fVar229 = auVar76._0_4_;
                  fVar253 = fVar249;
                  fVar215 = fVar249;
                  fVar216 = fVar249;
                }
                auVar262 = ZEXT1664(auVar81);
                auVar257 = ZEXT1664(local_700._0_16_);
                auVar254 = ZEXT1664(local_6e0._0_16_);
                auVar275 = ZEXT3264(local_8c0);
                auVar267 = ZEXT3264(local_8e0);
                auVar268 = ZEXT3264(local_900);
                auVar269 = ZEXT3264(local_920);
                auVar270 = ZEXT3264(local_800);
                auVar271 = ZEXT3264(local_940);
                auVar272 = ZEXT3264(local_820);
                auVar273 = ZEXT3264(local_960);
                auVar274 = ZEXT3264(local_980);
                auVar276 = ZEXT3264(local_840);
                auVar277 = ZEXT3264(local_860);
                auVar278 = ZEXT3264(local_8a0);
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar222,local_880._0_16_);
                auVar76 = vfmadd231ss_fma(auVar222,local_880._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar230 = local_880._0_4_;
                auVar196._0_4_ = fVar230 * (float)local_6a0._0_4_;
                auVar196._4_4_ = fVar230 * (float)local_6a0._4_4_;
                auVar196._8_4_ = fVar230 * fStack_698;
                auVar196._12_4_ = fVar230 * fStack_694;
                auVar214._0_4_ = auVar76._0_4_;
                auVar214._4_4_ = auVar214._0_4_;
                auVar214._8_4_ = auVar214._0_4_;
                auVar214._12_4_ = auVar214._0_4_;
                auVar76 = vfmadd132ps_fma(auVar214,auVar196,local_660._0_16_);
                auVar171._0_4_ = auVar80._0_4_;
                auVar171._4_4_ = auVar171._0_4_;
                auVar171._8_4_ = auVar171._0_4_;
                auVar171._12_4_ = auVar171._0_4_;
                auVar76 = vfmadd132ps_fma(auVar171,auVar76,local_680._0_16_);
                auVar76 = vfmadd132ps_fma(_local_560,auVar76,local_640._0_16_);
                auVar172._0_4_ = auVar76._0_4_ * (float)local_580._0_4_;
                auVar172._4_4_ = auVar76._4_4_ * (float)local_580._0_4_;
                auVar172._8_4_ = auVar76._8_4_ * (float)local_580._0_4_;
                auVar172._12_4_ = auVar76._12_4_ * (float)local_580._0_4_;
                auVar76 = vdpps_avx(auVar81,auVar76,0x7f);
                fVar217 = auVar76._0_4_;
                auVar197._0_4_ = auVar81._0_4_ * fVar217;
                auVar197._4_4_ = auVar81._4_4_ * fVar217;
                auVar197._8_4_ = auVar81._8_4_ * fVar217;
                auVar197._12_4_ = auVar81._12_4_ * fVar217;
                auVar76 = vsubps_avx(auVar172,auVar197);
                fVar217 = (float)local_5c0._0_4_ * (float)local_5a0._0_4_;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar79 = vxorps_avx512vl(auVar81,auVar29);
                auVar226._0_4_ = fVar249 * auVar76._0_4_ * fVar217;
                auVar226._4_4_ = fVar253 * auVar76._4_4_ * fVar217;
                auVar226._8_4_ = fVar215 * auVar76._8_4_ * fVar217;
                auVar226._12_4_ = fVar216 * auVar76._12_4_ * fVar217;
                auVar76 = vdpps_avx(auVar79,auVar266,0x7f);
                auVar222 = vmaxss_avx(ZEXT416((uint)fVar218),
                                      ZEXT416((uint)((float)local_7a0._0_4_ *
                                                    fVar228 * 1.9073486e-06)));
                auVar80 = vdivss_avx512f(ZEXT416((uint)fVar218),auVar82);
                auVar82 = vdpps_avx(local_6e0._0_16_,auVar226,0x7f);
                auVar74 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar218),auVar222);
                auVar80 = vfmadd213ss_fma(ZEXT416((uint)fVar239),auVar80,auVar74);
                auVar74 = vdpps_avx(local_6b0,auVar266,0x7f);
                fVar249 = auVar76._0_4_ + auVar82._0_4_;
                auVar76 = vdpps_avx(local_6e0._0_16_,auVar79,0x7f);
                auVar78 = vmulss_avx512f(auVar78,auVar77);
                auVar77 = vmulss_avx512f(auVar77,auVar77);
                auVar82 = vdpps_avx(local_6e0._0_16_,local_6b0,0x7f);
                auVar78 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar78._0_4_ * auVar77._0_4_)));
                auVar77 = vfnmadd231ss_fma(auVar76,auVar73,ZEXT416((uint)fVar249));
                auVar75 = vfnmadd231ss_fma(auVar82,auVar73,auVar74);
                auVar76 = vpermilps_avx(local_540._0_16_,0xff);
                fVar229 = fVar229 - auVar76._0_4_;
                auVar76 = vshufps_avx(auVar81,auVar81,0xff);
                auVar82 = vfmsub213ss_fma(auVar77,auVar78,auVar76);
                fVar239 = auVar75._0_4_ * auVar78._0_4_;
                auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar82._0_4_)),
                                          ZEXT416((uint)fVar249),ZEXT416((uint)fVar239));
                auVar248 = ZEXT1664(auVar77);
                fVar253 = auVar77._0_4_;
                fVar230 = fVar230 - (fVar252 * (fVar239 / fVar253) -
                                    fVar229 * (auVar74._0_4_ / fVar253));
                auVar178 = ZEXT464((uint)fVar230);
                fVar231 = (float)local_7a0._0_4_ -
                          (fVar229 * (fVar249 / fVar253) - fVar252 * (auVar82._0_4_ / fVar253));
                auVar251 = ZEXT464((uint)fVar231);
                auVar30._8_4_ = 0x7fffffff;
                auVar30._0_8_ = 0x7fffffff7fffffff;
                auVar30._12_4_ = 0x7fffffff;
                auVar74 = vandps_avx512vl(auVar73,auVar30);
                fVar249 = (float)local_9a0._0_4_;
                fVar252 = (float)local_9a0._4_4_;
                fVar253 = fStack_998;
                fVar215 = fStack_994;
                fVar216 = fStack_990;
                fVar217 = fStack_98c;
                fVar238 = fStack_988;
                fVar239 = fStack_984;
                if (auVar74._0_4_ < auVar80._0_4_) {
                  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar222._0_4_)),
                                            local_610,ZEXT416(0x36000000));
                  auVar31._8_4_ = 0x7fffffff;
                  auVar31._0_8_ = 0x7fffffff7fffffff;
                  auVar31._12_4_ = 0x7fffffff;
                  auVar73 = vandps_avx512vl(ZEXT416((uint)fVar229),auVar31);
                  if (auVar73._0_4_ < auVar74._0_4_) {
                    fVar228 = fVar231 + (float)local_620._0_4_;
                    if (fVar228 < fVar152) {
                      bVar58 = 0;
                      goto LAB_01ba38e8;
                    }
                    fVar229 = *(float *)(ray + k * 4 + 0x80);
                    auVar248 = ZEXT464((uint)fVar229);
                    auVar178 = ZEXT3264(_local_720);
                    if (fVar228 <= fVar229) {
                      bVar58 = 0;
                      if ((fVar230 < 0.0) || (1.0 < fVar230)) goto LAB_01ba38f1;
                      auVar198._4_12_ = SUB1612(ZEXT816(0),0);
                      auVar198._0_4_ = local_700._0_4_;
                      auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar198);
                      fVar232 = auVar74._0_4_;
                      pGVar3 = (context->scene->geometries).items[local_758].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar58 = 0;
                        goto LAB_01ba38f1;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar58 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01ba38f1;
                      fVar232 = fVar232 * 1.5 + local_700._0_4_ * -0.5 * fVar232 * fVar232 * fVar232
                      ;
                      auVar199._0_4_ = local_6e0._0_4_ * fVar232;
                      auVar199._4_4_ = local_6e0._4_4_ * fVar232;
                      auVar199._8_4_ = local_6e0._8_4_ * fVar232;
                      auVar199._12_4_ = local_6e0._12_4_ * fVar232;
                      auVar82 = vfmadd213ps_fma(auVar76,auVar199,auVar81);
                      auVar74 = vshufps_avx(auVar199,auVar199,0xc9);
                      auVar73 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar200._0_4_ = auVar199._0_4_ * auVar73._0_4_;
                      auVar200._4_4_ = auVar199._4_4_ * auVar73._4_4_;
                      auVar200._8_4_ = auVar199._8_4_ * auVar73._8_4_;
                      auVar200._12_4_ = auVar199._12_4_ * auVar73._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar200,auVar81,auVar74);
                      auVar74 = vshufps_avx(auVar76,auVar76,0xc9);
                      auVar73 = vshufps_avx(auVar82,auVar82,0xc9);
                      auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                      auVar145._0_4_ = auVar82._0_4_ * auVar76._0_4_;
                      auVar145._4_4_ = auVar82._4_4_ * auVar76._4_4_;
                      auVar145._8_4_ = auVar82._8_4_ * auVar76._8_4_;
                      auVar145._12_4_ = auVar82._12_4_ * auVar76._12_4_;
                      auVar74 = vfmsub231ps_fma(auVar145,auVar74,auVar73);
                      local_4e0 = (RTCHitN  [16])vshufps_avx(auVar74,auVar74,0x55);
                      auStack_4d0 = vshufps_avx(auVar74,auVar74,0xaa);
                      local_4c0 = auVar74._0_4_;
                      uStack_4bc = local_4c0;
                      uStack_4b8 = local_4c0;
                      uStack_4b4 = local_4c0;
                      local_4b0 = fVar230;
                      fStack_4ac = fVar230;
                      fStack_4a8 = fVar230;
                      fStack_4a4 = fVar230;
                      local_4a0 = ZEXT416(0) << 0x20;
                      local_490 = local_4f0._0_8_;
                      uStack_488 = local_4f0._8_8_;
                      local_480 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_46c = context->user->instID[0];
                      local_470 = uStack_46c;
                      uStack_468 = uStack_46c;
                      uStack_464 = uStack_46c;
                      uStack_460 = context->user->instPrimID[0];
                      uStack_45c = uStack_460;
                      uStack_458 = uStack_460;
                      uStack_454 = uStack_460;
                      *(float *)(ray + k * 4 + 0x80) = fVar228;
                      local_9c0 = local_510;
                      local_750.valid = (int *)local_9c0;
                      local_750.geometryUserPtr = pGVar3->userPtr;
                      local_750.context = context->user;
                      local_750.hit = local_4e0;
                      local_750.N = 4;
                      local_750.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar251 = ZEXT464((uint)fVar231);
                        auVar254 = ZEXT1664(local_6e0._0_16_);
                        auVar257 = ZEXT1664(local_700._0_16_);
                        auVar262 = ZEXT1664(auVar81);
                        (*pGVar3->occlusionFilterN)(&local_750);
                        auVar178 = ZEXT3264(_local_720);
                        auVar278 = ZEXT3264(local_8a0);
                        auVar277 = ZEXT3264(local_860);
                        auVar276 = ZEXT3264(local_840);
                        auVar274 = ZEXT3264(local_980);
                        auVar273 = ZEXT3264(local_960);
                        auVar272 = ZEXT3264(local_820);
                        auVar271 = ZEXT3264(local_940);
                        auVar270 = ZEXT3264(local_800);
                        auVar269 = ZEXT3264(local_920);
                        auVar268 = ZEXT3264(local_900);
                        auVar267 = ZEXT3264(local_8e0);
                        auVar275 = ZEXT3264(local_8c0);
                        fVar249 = (float)local_9a0._0_4_;
                        fVar252 = (float)local_9a0._4_4_;
                        fVar253 = fStack_998;
                        fVar215 = fStack_994;
                        fVar216 = fStack_990;
                        fVar217 = fStack_98c;
                        fVar238 = fStack_988;
                        fVar239 = fStack_984;
                      }
                      uVar67 = vptestmd_avx512vl(local_9c0,local_9c0);
                      if ((uVar67 & 0xf) != 0) {
                        p_Var7 = context->args->filter;
                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar251 = ZEXT1664(auVar251._0_16_);
                          auVar254 = ZEXT1664(auVar254._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          (*p_Var7)(&local_750);
                          auVar178 = ZEXT3264(_local_720);
                          auVar278 = ZEXT3264(local_8a0);
                          auVar277 = ZEXT3264(local_860);
                          auVar276 = ZEXT3264(local_840);
                          auVar274 = ZEXT3264(local_980);
                          auVar273 = ZEXT3264(local_960);
                          auVar272 = ZEXT3264(local_820);
                          auVar271 = ZEXT3264(local_940);
                          auVar270 = ZEXT3264(local_800);
                          auVar269 = ZEXT3264(local_920);
                          auVar268 = ZEXT3264(local_900);
                          auVar267 = ZEXT3264(local_8e0);
                          auVar275 = ZEXT3264(local_8c0);
                          fVar249 = (float)local_9a0._0_4_;
                          fVar252 = (float)local_9a0._4_4_;
                          fVar253 = fStack_998;
                          fVar215 = fStack_994;
                          fVar216 = fStack_990;
                          fVar217 = fStack_98c;
                          fVar238 = fStack_988;
                          fVar239 = fStack_984;
                        }
                        auVar248 = ZEXT464((uint)fVar229);
                        uVar67 = vptestmd_avx512vl(local_9c0,local_9c0);
                        uVar67 = uVar67 & 0xf;
                        auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar8 = (bool)((byte)uVar67 & 1);
                        auVar83._0_4_ =
                             (uint)bVar8 * auVar74._0_4_ |
                             (uint)!bVar8 * *(int *)(local_750.ray + 0x80);
                        bVar8 = (bool)((byte)(uVar67 >> 1) & 1);
                        auVar83._4_4_ =
                             (uint)bVar8 * auVar74._4_4_ |
                             (uint)!bVar8 * *(int *)(local_750.ray + 0x84);
                        bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                        auVar83._8_4_ =
                             (uint)bVar8 * auVar74._8_4_ |
                             (uint)!bVar8 * *(int *)(local_750.ray + 0x88);
                        bVar8 = SUB81(uVar67 >> 3,0);
                        auVar83._12_4_ =
                             (uint)bVar8 * auVar74._12_4_ |
                             (uint)!bVar8 * *(int *)(local_750.ray + 0x8c);
                        *(undefined1 (*) [16])(local_750.ray + 0x80) = auVar83;
                        bVar58 = 1;
                        if ((byte)uVar67 != 0) goto LAB_01ba38f1;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar229;
                    }
                    auVar248 = ZEXT464((uint)fVar229);
                    bVar58 = 0;
                    goto LAB_01ba38f1;
                  }
                }
                bVar66 = uVar67 < 4;
                uVar67 = uVar67 + 1;
              } while (uVar67 != 5);
              bVar66 = false;
              bVar58 = 5;
LAB_01ba38e8:
              auVar178 = ZEXT3264(_local_720);
LAB_01ba38f1:
              bVar64 = (bool)(bVar64 | bVar66 & bVar58);
              uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar149._4_4_ = uVar159;
              auVar149._0_4_ = uVar159;
              auVar149._8_4_ = uVar159;
              auVar149._12_4_ = uVar159;
              auVar149._16_4_ = uVar159;
              auVar149._20_4_ = uVar159;
              auVar149._24_4_ = uVar159;
              auVar149._28_4_ = uVar159;
              auVar54._4_4_ = fStack_3bc;
              auVar54._0_4_ = local_3c0;
              auVar54._8_4_ = fStack_3b8;
              auVar54._12_4_ = fStack_3b4;
              auVar54._16_4_ = fStack_3b0;
              auVar54._20_4_ = fStack_3ac;
              auVar54._24_4_ = fStack_3a8;
              auVar54._28_4_ = fStack_3a4;
              uVar15 = vcmpps_avx512vl(auVar149,auVar54,0xd);
              bVar63 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar63 & (byte)uVar15;
              auVar123 = local_3e0;
            } while (bVar63 != 0);
          }
          uVar16 = vpcmpgtd_avx512vl(auVar123,local_380);
          uVar18 = vpcmpd_avx512vl(local_380,local_300,1);
          auVar202._0_4_ = fVar249 + (float)local_1c0._0_4_;
          auVar202._4_4_ = fVar252 + (float)local_1c0._4_4_;
          auVar202._8_4_ = fVar253 + fStack_1b8;
          auVar202._12_4_ = fVar215 + fStack_1b4;
          auVar202._16_4_ = fVar216 + fStack_1b0;
          auVar202._20_4_ = fVar217 + fStack_1ac;
          auVar202._24_4_ = fVar238 + fStack_1a8;
          auVar202._28_4_ = fVar239 + fStack_1a4;
          uVar15 = vcmpps_avx512vl(auVar202,auVar149,2);
          bVar60 = bVar60 & (byte)uVar18 & (byte)uVar15;
          auVar203._0_4_ = fVar249 + local_360._0_4_;
          auVar203._4_4_ = fVar252 + local_360._4_4_;
          auVar203._8_4_ = fVar253 + local_360._8_4_;
          auVar203._12_4_ = fVar215 + local_360._12_4_;
          auVar203._16_4_ = fVar216 + local_360._16_4_;
          auVar203._20_4_ = fVar217 + local_360._20_4_;
          auVar203._24_4_ = fVar238 + local_360._24_4_;
          auVar203._28_4_ = fVar239 + local_360._28_4_;
          uVar15 = vcmpps_avx512vl(auVar203,auVar149,2);
          bVar56 = bVar56 & (byte)uVar16 & (byte)uVar15 | bVar60;
          if (bVar56 != 0) {
            abStack_180[uVar62 * 0x60] = bVar56;
            auVar125._0_4_ =
                 (uint)(bVar60 & 1) * local_1c0._0_4_ |
                 (uint)!(bool)(bVar60 & 1) * (int)local_360._0_4_;
            bVar66 = (bool)(bVar60 >> 1 & 1);
            auVar125._4_4_ = (uint)bVar66 * local_1c0._4_4_ | (uint)!bVar66 * (int)local_360._4_4_;
            bVar66 = (bool)(bVar60 >> 2 & 1);
            auVar125._8_4_ = (uint)bVar66 * (int)fStack_1b8 | (uint)!bVar66 * (int)local_360._8_4_;
            bVar66 = (bool)(bVar60 >> 3 & 1);
            auVar125._12_4_ = (uint)bVar66 * (int)fStack_1b4 | (uint)!bVar66 * (int)local_360._12_4_
            ;
            bVar66 = (bool)(bVar60 >> 4 & 1);
            auVar125._16_4_ = (uint)bVar66 * (int)fStack_1b0 | (uint)!bVar66 * (int)local_360._16_4_
            ;
            bVar66 = (bool)(bVar60 >> 5 & 1);
            auVar125._20_4_ = (uint)bVar66 * (int)fStack_1ac | (uint)!bVar66 * (int)local_360._20_4_
            ;
            auVar125._24_4_ =
                 (uint)(bVar60 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar60 >> 6) * (int)local_360._24_4_;
            auVar125._28_4_ = local_360._28_4_;
            *(undefined1 (*) [32])(auStack_160 + uVar62 * 0x60) = auVar125;
            uVar67 = vmovlps_avx(local_390);
            (&uStack_140)[uVar62 * 0xc] = uVar67;
            aiStack_138[uVar62 * 0x18] = local_9ac + 1;
            uVar62 = (ulong)((int)uVar62 + 1);
          }
        }
      }
    }
    do {
      uVar61 = (uint)uVar62;
      uVar62 = (ulong)(uVar61 - 1);
      if (uVar61 == 0) {
        if (bVar64 != false) {
          return bVar64;
        }
        uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar32._4_4_ = uVar159;
        auVar32._0_4_ = uVar159;
        auVar32._8_4_ = uVar159;
        auVar32._12_4_ = uVar159;
        uVar15 = vcmpps_avx512vl(local_3a0,auVar32,2);
        uVar61 = (uint)uVar15 & (uint)local_5c8 - 1 & (uint)local_5c8;
        local_5c8 = (ulong)uVar61;
        if (uVar61 == 0) {
          return false;
        }
        goto LAB_01ba1509;
      }
      lVar59 = uVar62 * 0x60;
      auVar87 = *(undefined1 (*) [32])(auStack_160 + lVar59);
      auVar176._0_4_ = fVar249 + auVar87._0_4_;
      auVar176._4_4_ = fVar252 + auVar87._4_4_;
      auVar176._8_4_ = fVar253 + auVar87._8_4_;
      auVar176._12_4_ = fVar215 + auVar87._12_4_;
      auVar176._16_4_ = fVar216 + auVar87._16_4_;
      auVar176._20_4_ = fVar217 + auVar87._20_4_;
      auVar176._24_4_ = fVar238 + auVar87._24_4_;
      auVar176._28_4_ = fVar239 + auVar87._28_4_;
      uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar37._4_4_ = uVar159;
      auVar37._0_4_ = uVar159;
      auVar37._8_4_ = uVar159;
      auVar37._12_4_ = uVar159;
      auVar37._16_4_ = uVar159;
      auVar37._20_4_ = uVar159;
      auVar37._24_4_ = uVar159;
      auVar37._28_4_ = uVar159;
      uVar15 = vcmpps_avx512vl(auVar176,auVar37,2);
      uVar69 = (uint)uVar15 & (uint)abStack_180[lVar59];
    } while (uVar69 == 0);
    uVar67 = (&uStack_140)[uVar62 * 0xc];
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar67;
    auVar204._8_4_ = 0x7f800000;
    auVar204._0_8_ = 0x7f8000007f800000;
    auVar204._12_4_ = 0x7f800000;
    auVar204._16_4_ = 0x7f800000;
    auVar204._20_4_ = 0x7f800000;
    auVar204._24_4_ = 0x7f800000;
    auVar204._28_4_ = 0x7f800000;
    auVar84 = vblendmps_avx512vl(auVar204,auVar87);
    bVar56 = (byte)uVar69;
    auVar126._0_4_ =
         (uint)(bVar56 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)auVar87._0_4_;
    bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
    auVar126._4_4_ = (uint)bVar66 * auVar84._4_4_ | (uint)!bVar66 * (int)auVar87._4_4_;
    bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
    auVar126._8_4_ = (uint)bVar66 * auVar84._8_4_ | (uint)!bVar66 * (int)auVar87._8_4_;
    bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
    auVar126._12_4_ = (uint)bVar66 * auVar84._12_4_ | (uint)!bVar66 * (int)auVar87._12_4_;
    bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
    auVar126._16_4_ = (uint)bVar66 * auVar84._16_4_ | (uint)!bVar66 * (int)auVar87._16_4_;
    bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
    auVar126._20_4_ = (uint)bVar66 * auVar84._20_4_ | (uint)!bVar66 * (int)auVar87._20_4_;
    bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
    auVar126._24_4_ = (uint)bVar66 * auVar84._24_4_ | (uint)!bVar66 * (int)auVar87._24_4_;
    auVar126._28_4_ =
         (uVar69 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar69 >> 7,0) * (int)auVar87._28_4_;
    auVar87 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar87 = vminps_avx(auVar126,auVar87);
    auVar84 = vshufpd_avx(auVar87,auVar87,5);
    auVar87 = vminps_avx(auVar87,auVar84);
    auVar84 = vpermpd_avx2(auVar87,0x4e);
    auVar87 = vminps_avx(auVar87,auVar84);
    uVar15 = vcmpps_avx512vl(auVar126,auVar87,0);
    bVar60 = (byte)uVar15 & bVar56;
    if (bVar60 != 0) {
      uVar69 = (uint)bVar60;
    }
    uVar127 = 0;
    for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
      uVar127 = uVar127 + 1;
    }
    local_9ac = aiStack_138[uVar62 * 0x18];
    bVar56 = ~('\x01' << ((byte)uVar127 & 0x1f)) & bVar56;
    abStack_180[lVar59] = bVar56;
    if (bVar56 == 0) {
      uVar61 = uVar61 - 1;
    }
    uVar159 = (undefined4)uVar67;
    auVar151._4_4_ = uVar159;
    auVar151._0_4_ = uVar159;
    auVar151._8_4_ = uVar159;
    auVar151._12_4_ = uVar159;
    auVar151._16_4_ = uVar159;
    auVar151._20_4_ = uVar159;
    auVar151._24_4_ = uVar159;
    auVar151._28_4_ = uVar159;
    auVar74 = vmovshdup_avx(auVar173);
    auVar74 = vsubps_avx(auVar74,auVar173);
    auVar177._0_4_ = auVar74._0_4_;
    auVar177._4_4_ = auVar177._0_4_;
    auVar177._8_4_ = auVar177._0_4_;
    auVar177._12_4_ = auVar177._0_4_;
    auVar177._16_4_ = auVar177._0_4_;
    auVar177._20_4_ = auVar177._0_4_;
    auVar177._24_4_ = auVar177._0_4_;
    auVar177._28_4_ = auVar177._0_4_;
    auVar74 = vfmadd132ps_fma(auVar177,auVar151,_DAT_01faff20);
    _local_4e0 = ZEXT1632(auVar74);
    auVar178 = ZEXT864(*(ulong *)(local_4e0 + (ulong)uVar127 * 4));
    uVar62 = (ulong)uVar61;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }